

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  long lVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  uint uVar88;
  ulong uVar89;
  undefined1 (*pauVar90) [32];
  uint uVar91;
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  undefined4 uVar95;
  long lVar96;
  ulong uVar97;
  int iVar98;
  float fVar99;
  float fVar126;
  float fVar128;
  __m128 a;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar127;
  float fVar129;
  float fVar131;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar130;
  float fVar138;
  undefined1 auVar116 [32];
  float fVar133;
  float fVar135;
  float fVar137;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar110 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar139;
  float fVar166;
  float fVar167;
  undefined1 auVar140 [16];
  undefined1 auVar152 [32];
  undefined1 auVar141 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar168;
  undefined1 auVar142 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar169;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar171 [16];
  float fVar170;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar191;
  float fVar192;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar193;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar174 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar194;
  float fVar216;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [28];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar219;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar238;
  undefined1 auVar229 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar240;
  float fVar257;
  float fVar258;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar260;
  float fVar261;
  float fVar263;
  undefined1 auVar247 [32];
  float fVar259;
  undefined1 auVar248 [32];
  float fVar265;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar262;
  float fVar264;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar266;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar281;
  float fVar282;
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar283;
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar274 [32];
  float fVar285;
  float fVar288;
  float fVar291;
  float fVar294;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  float fVar295;
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar308;
  float fVar310;
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar317;
  float fVar324;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar331 [16];
  undefined1 auVar332 [28];
  float fVar337;
  float fVar339;
  float fVar343;
  float fVar345;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  undefined1 auVar351 [32];
  float fVar361;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [64];
  float fVar362;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar374;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  float fVar375;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float in_register_0000151c;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [64];
  float fVar388;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float in_register_0000159c;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  float local_b00;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  float local_958;
  float local_954;
  undefined4 local_950;
  uint local_94c;
  uint local_948;
  uint local_944;
  uint local_940;
  Primitive *local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar9 = prim[1];
  uVar94 = (ulong)(byte)PVar9;
  lVar96 = uVar94 * 5;
  lVar79 = uVar94 * 0x19;
  fVar194 = *(float *)(prim + lVar79 + 0x12);
  auVar107 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar79 + 6));
  auVar241._0_4_ = fVar194 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar241._4_4_ = fVar194 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar241._8_4_ = fVar194 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar241._12_4_ = fVar194 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 10)));
  auVar140._0_4_ = fVar194 * auVar107._0_4_;
  auVar140._4_4_ = fVar194 * auVar107._4_4_;
  auVar140._8_4_ = fVar194 * auVar107._8_4_;
  auVar140._12_4_ = fVar194 * auVar107._12_4_;
  auVar111._16_16_ = auVar27;
  auVar111._0_16_ = auVar102;
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar96 + 10)));
  auVar178._16_16_ = auVar27;
  auVar178._0_16_ = auVar102;
  auVar165 = vcvtdq2ps_avx(auVar178);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 10)));
  auVar207._16_16_ = auVar27;
  auVar207._0_16_ = auVar102;
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 10)));
  auVar15 = vcvtdq2ps_avx(auVar207);
  auVar208._16_16_ = auVar27;
  auVar208._0_16_ = auVar102;
  auVar16 = vcvtdq2ps_avx(auVar208);
  uVar97 = (ulong)((uint)(byte)PVar9 * 0xc);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 10)));
  auVar271._16_16_ = auVar27;
  auVar271._0_16_ = auVar102;
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar94 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar271);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar94 + 10)));
  auVar296._16_16_ = auVar27;
  auVar296._0_16_ = auVar102;
  lVar12 = uVar94 * 9;
  uVar97 = (ulong)(uint)((int)lVar12 * 2);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar296);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 10)));
  auVar297._16_16_ = auVar27;
  auVar297._0_16_ = auVar102;
  auVar181 = vcvtdq2ps_avx(auVar297);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar94 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar94 + 10)));
  auVar333._16_16_ = auVar27;
  auVar333._0_16_ = auVar102;
  uVar97 = (ulong)(uint)((int)lVar96 << 2);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 10)));
  auVar18 = vcvtdq2ps_avx(auVar333);
  auVar351._16_16_ = auVar27;
  auVar351._0_16_ = auVar102;
  auVar19 = vcvtdq2ps_avx(auVar351);
  auVar102 = vshufps_avx(auVar241,auVar241,0);
  auVar27 = vshufps_avx(auVar241,auVar241,0x55);
  auVar107 = vshufps_avx(auVar241,auVar241,0xaa);
  fVar194 = auVar107._0_4_;
  fVar214 = auVar107._4_4_;
  fVar215 = auVar107._8_4_;
  fVar216 = auVar107._12_4_;
  fVar217 = auVar27._0_4_;
  fVar218 = auVar27._4_4_;
  fVar219 = auVar27._8_4_;
  fVar220 = auVar27._12_4_;
  fVar232 = auVar102._0_4_;
  fVar233 = auVar102._4_4_;
  fVar234 = auVar102._8_4_;
  fVar235 = auVar102._12_4_;
  auVar376._0_4_ = fVar232 * auVar111._0_4_ + fVar217 * auVar165._0_4_ + fVar194 * auVar15._0_4_;
  auVar376._4_4_ = fVar233 * auVar111._4_4_ + fVar218 * auVar165._4_4_ + fVar214 * auVar15._4_4_;
  auVar376._8_4_ = fVar234 * auVar111._8_4_ + fVar219 * auVar165._8_4_ + fVar215 * auVar15._8_4_;
  auVar376._12_4_ = fVar235 * auVar111._12_4_ + fVar220 * auVar165._12_4_ + fVar216 * auVar15._12_4_
  ;
  auVar376._16_4_ = fVar232 * auVar111._16_4_ + fVar217 * auVar165._16_4_ + fVar194 * auVar15._16_4_
  ;
  auVar376._20_4_ = fVar233 * auVar111._20_4_ + fVar218 * auVar165._20_4_ + fVar214 * auVar15._20_4_
  ;
  auVar376._24_4_ = fVar234 * auVar111._24_4_ + fVar219 * auVar165._24_4_ + fVar215 * auVar15._24_4_
  ;
  auVar376._28_4_ = fVar220 + in_register_000015dc + in_register_0000151c;
  auVar363._0_4_ = fVar232 * auVar16._0_4_ + fVar217 * auVar17._0_4_ + auVar157._0_4_ * fVar194;
  auVar363._4_4_ = fVar233 * auVar16._4_4_ + fVar218 * auVar17._4_4_ + auVar157._4_4_ * fVar214;
  auVar363._8_4_ = fVar234 * auVar16._8_4_ + fVar219 * auVar17._8_4_ + auVar157._8_4_ * fVar215;
  auVar363._12_4_ = fVar235 * auVar16._12_4_ + fVar220 * auVar17._12_4_ + auVar157._12_4_ * fVar216;
  auVar363._16_4_ = fVar232 * auVar16._16_4_ + fVar217 * auVar17._16_4_ + auVar157._16_4_ * fVar194;
  auVar363._20_4_ = fVar233 * auVar16._20_4_ + fVar218 * auVar17._20_4_ + auVar157._20_4_ * fVar214;
  auVar363._24_4_ = fVar234 * auVar16._24_4_ + fVar219 * auVar17._24_4_ + auVar157._24_4_ * fVar215;
  auVar363._28_4_ = fVar220 + in_register_000015dc + in_register_0000159c;
  auVar247._0_4_ = fVar232 * auVar181._0_4_ + fVar217 * auVar18._0_4_ + auVar19._0_4_ * fVar194;
  auVar247._4_4_ = fVar233 * auVar181._4_4_ + fVar218 * auVar18._4_4_ + auVar19._4_4_ * fVar214;
  auVar247._8_4_ = fVar234 * auVar181._8_4_ + fVar219 * auVar18._8_4_ + auVar19._8_4_ * fVar215;
  auVar247._12_4_ = fVar235 * auVar181._12_4_ + fVar220 * auVar18._12_4_ + auVar19._12_4_ * fVar216;
  auVar247._16_4_ = fVar232 * auVar181._16_4_ + fVar217 * auVar18._16_4_ + auVar19._16_4_ * fVar194;
  auVar247._20_4_ = fVar233 * auVar181._20_4_ + fVar218 * auVar18._20_4_ + auVar19._20_4_ * fVar214;
  auVar247._24_4_ = fVar234 * auVar181._24_4_ + fVar219 * auVar18._24_4_ + auVar19._24_4_ * fVar215;
  auVar247._28_4_ = fVar235 + fVar220 + fVar216;
  auVar102 = vshufps_avx(auVar140,auVar140,0);
  auVar27 = vshufps_avx(auVar140,auVar140,0x55);
  auVar107 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar214 = auVar107._0_4_;
  fVar215 = auVar107._4_4_;
  fVar216 = auVar107._8_4_;
  fVar217 = auVar107._12_4_;
  fVar233 = auVar27._0_4_;
  fVar234 = auVar27._4_4_;
  fVar235 = auVar27._8_4_;
  fVar236 = auVar27._12_4_;
  fVar218 = auVar102._0_4_;
  fVar219 = auVar102._4_4_;
  fVar220 = auVar102._8_4_;
  fVar232 = auVar102._12_4_;
  fVar194 = auVar111._28_4_;
  auVar272._0_4_ = fVar218 * auVar111._0_4_ + fVar233 * auVar165._0_4_ + fVar214 * auVar15._0_4_;
  auVar272._4_4_ = fVar219 * auVar111._4_4_ + fVar234 * auVar165._4_4_ + fVar215 * auVar15._4_4_;
  auVar272._8_4_ = fVar220 * auVar111._8_4_ + fVar235 * auVar165._8_4_ + fVar216 * auVar15._8_4_;
  auVar272._12_4_ = fVar232 * auVar111._12_4_ + fVar236 * auVar165._12_4_ + fVar217 * auVar15._12_4_
  ;
  auVar272._16_4_ = fVar218 * auVar111._16_4_ + fVar233 * auVar165._16_4_ + fVar214 * auVar15._16_4_
  ;
  auVar272._20_4_ = fVar219 * auVar111._20_4_ + fVar234 * auVar165._20_4_ + fVar215 * auVar15._20_4_
  ;
  auVar272._24_4_ = fVar220 * auVar111._24_4_ + fVar235 * auVar165._24_4_ + fVar216 * auVar15._24_4_
  ;
  auVar272._28_4_ = fVar194 + auVar165._28_4_ + auVar15._28_4_;
  auVar152._0_4_ = fVar218 * auVar16._0_4_ + auVar157._0_4_ * fVar214 + fVar233 * auVar17._0_4_;
  auVar152._4_4_ = fVar219 * auVar16._4_4_ + auVar157._4_4_ * fVar215 + fVar234 * auVar17._4_4_;
  auVar152._8_4_ = fVar220 * auVar16._8_4_ + auVar157._8_4_ * fVar216 + fVar235 * auVar17._8_4_;
  auVar152._12_4_ = fVar232 * auVar16._12_4_ + auVar157._12_4_ * fVar217 + fVar236 * auVar17._12_4_;
  auVar152._16_4_ = fVar218 * auVar16._16_4_ + auVar157._16_4_ * fVar214 + fVar233 * auVar17._16_4_;
  auVar152._20_4_ = fVar219 * auVar16._20_4_ + auVar157._20_4_ * fVar215 + fVar234 * auVar17._20_4_;
  auVar152._24_4_ = fVar220 * auVar16._24_4_ + auVar157._24_4_ * fVar216 + fVar235 * auVar17._24_4_;
  auVar152._28_4_ = fVar194 + auVar157._28_4_ + auVar15._28_4_;
  auVar298._8_4_ = 0x7fffffff;
  auVar298._0_8_ = 0x7fffffff7fffffff;
  auVar298._12_4_ = 0x7fffffff;
  auVar298._16_4_ = 0x7fffffff;
  auVar298._20_4_ = 0x7fffffff;
  auVar298._24_4_ = 0x7fffffff;
  auVar298._28_4_ = 0x7fffffff;
  auVar334._8_4_ = 0x219392ef;
  auVar334._0_8_ = 0x219392ef219392ef;
  auVar334._12_4_ = 0x219392ef;
  auVar334._16_4_ = 0x219392ef;
  auVar334._20_4_ = 0x219392ef;
  auVar334._24_4_ = 0x219392ef;
  auVar334._28_4_ = 0x219392ef;
  auVar111 = vandps_avx(auVar376,auVar298);
  auVar111 = vcmpps_avx(auVar111,auVar334,1);
  auVar165 = vblendvps_avx(auVar376,auVar334,auVar111);
  auVar111 = vandps_avx(auVar363,auVar298);
  auVar111 = vcmpps_avx(auVar111,auVar334,1);
  auVar15 = vblendvps_avx(auVar363,auVar334,auVar111);
  auVar111 = vandps_avx(auVar247,auVar298);
  auVar111 = vcmpps_avx(auVar111,auVar334,1);
  auVar111 = vblendvps_avx(auVar247,auVar334,auVar111);
  auVar179._0_4_ = fVar233 * auVar18._0_4_ + auVar19._0_4_ * fVar214 + fVar218 * auVar181._0_4_;
  auVar179._4_4_ = fVar234 * auVar18._4_4_ + auVar19._4_4_ * fVar215 + fVar219 * auVar181._4_4_;
  auVar179._8_4_ = fVar235 * auVar18._8_4_ + auVar19._8_4_ * fVar216 + fVar220 * auVar181._8_4_;
  auVar179._12_4_ = fVar236 * auVar18._12_4_ + auVar19._12_4_ * fVar217 + fVar232 * auVar181._12_4_;
  auVar179._16_4_ = fVar233 * auVar18._16_4_ + auVar19._16_4_ * fVar214 + fVar218 * auVar181._16_4_;
  auVar179._20_4_ = fVar234 * auVar18._20_4_ + auVar19._20_4_ * fVar215 + fVar219 * auVar181._20_4_;
  auVar179._24_4_ = fVar235 * auVar18._24_4_ + auVar19._24_4_ * fVar216 + fVar220 * auVar181._24_4_;
  auVar179._28_4_ = auVar17._28_4_ + fVar217 + fVar194;
  auVar16 = vrcpps_avx(auVar165);
  fVar194 = auVar16._0_4_;
  fVar214 = auVar16._4_4_;
  auVar17._4_4_ = auVar165._4_4_ * fVar214;
  auVar17._0_4_ = auVar165._0_4_ * fVar194;
  fVar215 = auVar16._8_4_;
  auVar17._8_4_ = auVar165._8_4_ * fVar215;
  fVar216 = auVar16._12_4_;
  auVar17._12_4_ = auVar165._12_4_ * fVar216;
  fVar217 = auVar16._16_4_;
  auVar17._16_4_ = auVar165._16_4_ * fVar217;
  fVar218 = auVar16._20_4_;
  auVar17._20_4_ = auVar165._20_4_ * fVar218;
  fVar219 = auVar16._24_4_;
  auVar17._24_4_ = auVar165._24_4_ * fVar219;
  auVar17._28_4_ = auVar165._28_4_;
  auVar320._8_4_ = 0x3f800000;
  auVar320._0_8_ = 0x3f8000003f800000;
  auVar320._12_4_ = 0x3f800000;
  auVar320._16_4_ = 0x3f800000;
  auVar320._20_4_ = 0x3f800000;
  auVar320._24_4_ = 0x3f800000;
  auVar320._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar320,auVar17);
  auVar165 = vrcpps_avx(auVar15);
  fVar194 = fVar194 + fVar194 * auVar17._0_4_;
  fVar214 = fVar214 + fVar214 * auVar17._4_4_;
  fVar215 = fVar215 + fVar215 * auVar17._8_4_;
  fVar216 = fVar216 + fVar216 * auVar17._12_4_;
  fVar217 = fVar217 + fVar217 * auVar17._16_4_;
  fVar218 = fVar218 + fVar218 * auVar17._20_4_;
  fVar219 = fVar219 + fVar219 * auVar17._24_4_;
  fVar240 = auVar165._0_4_;
  fVar257 = auVar165._4_4_;
  auVar157._4_4_ = fVar257 * auVar15._4_4_;
  auVar157._0_4_ = fVar240 * auVar15._0_4_;
  fVar258 = auVar165._8_4_;
  auVar157._8_4_ = fVar258 * auVar15._8_4_;
  fVar259 = auVar165._12_4_;
  auVar157._12_4_ = fVar259 * auVar15._12_4_;
  fVar260 = auVar165._16_4_;
  auVar157._16_4_ = fVar260 * auVar15._16_4_;
  fVar261 = auVar165._20_4_;
  auVar157._20_4_ = fVar261 * auVar15._20_4_;
  fVar263 = auVar165._24_4_;
  auVar157._24_4_ = fVar263 * auVar15._24_4_;
  auVar157._28_4_ = auVar16._28_4_;
  auVar165 = vsubps_avx(auVar320,auVar157);
  fVar240 = fVar240 + fVar240 * auVar165._0_4_;
  fVar257 = fVar257 + fVar257 * auVar165._4_4_;
  fVar258 = fVar258 + fVar258 * auVar165._8_4_;
  fVar259 = fVar259 + fVar259 * auVar165._12_4_;
  fVar260 = fVar260 + fVar260 * auVar165._16_4_;
  fVar261 = fVar261 + fVar261 * auVar165._20_4_;
  fVar263 = fVar263 + fVar263 * auVar165._24_4_;
  auVar165 = vrcpps_avx(auVar111);
  fVar220 = auVar165._0_4_;
  fVar232 = auVar165._4_4_;
  auVar181._4_4_ = fVar232 * auVar111._4_4_;
  auVar181._0_4_ = fVar220 * auVar111._0_4_;
  fVar233 = auVar165._8_4_;
  auVar181._8_4_ = fVar233 * auVar111._8_4_;
  fVar234 = auVar165._12_4_;
  auVar181._12_4_ = fVar234 * auVar111._12_4_;
  fVar235 = auVar165._16_4_;
  auVar181._16_4_ = fVar235 * auVar111._16_4_;
  fVar236 = auVar165._20_4_;
  auVar181._20_4_ = fVar236 * auVar111._20_4_;
  fVar238 = auVar165._24_4_;
  auVar181._24_4_ = fVar238 * auVar111._24_4_;
  auVar181._28_4_ = auVar15._28_4_;
  auVar111 = vsubps_avx(auVar320,auVar181);
  fVar220 = fVar220 + fVar220 * auVar111._0_4_;
  fVar232 = fVar232 + fVar232 * auVar111._4_4_;
  fVar233 = fVar233 + fVar233 * auVar111._8_4_;
  fVar234 = fVar234 + fVar234 * auVar111._12_4_;
  fVar235 = fVar235 + fVar235 * auVar111._16_4_;
  fVar236 = fVar236 + fVar236 * auVar111._20_4_;
  fVar238 = fVar238 + fVar238 * auVar111._24_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar94 * 7 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar27);
  auVar112._16_16_ = auVar27;
  auVar112._0_16_ = auVar102;
  auVar111 = vcvtdq2ps_avx(auVar112);
  auVar111 = vsubps_avx(auVar111,auVar272);
  auVar100._0_4_ = fVar194 * auVar111._0_4_;
  auVar100._4_4_ = fVar214 * auVar111._4_4_;
  auVar100._8_4_ = fVar215 * auVar111._8_4_;
  auVar100._12_4_ = fVar216 * auVar111._12_4_;
  auVar15._16_4_ = fVar217 * auVar111._16_4_;
  auVar15._0_16_ = auVar100;
  auVar15._20_4_ = fVar218 * auVar111._20_4_;
  auVar15._24_4_ = fVar219 * auVar111._24_4_;
  auVar15._28_4_ = auVar111._28_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar102 = vpmovsxwd_avx(auVar107);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar147);
  auVar299._16_16_ = auVar27;
  auVar299._0_16_ = auVar102;
  auVar111 = vcvtdq2ps_avx(auVar299);
  auVar111 = vsubps_avx(auVar111,auVar272);
  auVar195._0_4_ = fVar194 * auVar111._0_4_;
  auVar195._4_4_ = fVar214 * auVar111._4_4_;
  auVar195._8_4_ = fVar215 * auVar111._8_4_;
  auVar195._12_4_ = fVar216 * auVar111._12_4_;
  auVar18._16_4_ = fVar217 * auVar111._16_4_;
  auVar18._0_16_ = auVar195;
  auVar18._20_4_ = fVar218 * auVar111._20_4_;
  auVar18._24_4_ = fVar219 * auVar111._24_4_;
  auVar18._28_4_ = auVar16._28_4_ + auVar17._28_4_;
  lVar96 = (ulong)(byte)PVar9 * 0x10;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar102 = vpmovsxwd_avx(auVar106);
  auVar331._8_8_ = 0;
  auVar331._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar331);
  lVar96 = lVar96 + uVar94 * -2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar107 = vpmovsxwd_avx(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar5);
  auVar273._16_16_ = auVar147;
  auVar273._0_16_ = auVar107;
  auVar111 = vcvtdq2ps_avx(auVar273);
  auVar111 = vsubps_avx(auVar111,auVar152);
  auVar267._0_4_ = fVar240 * auVar111._0_4_;
  auVar267._4_4_ = fVar257 * auVar111._4_4_;
  auVar267._8_4_ = fVar258 * auVar111._8_4_;
  auVar267._12_4_ = fVar259 * auVar111._12_4_;
  auVar165._16_4_ = fVar260 * auVar111._16_4_;
  auVar165._0_16_ = auVar267;
  auVar165._20_4_ = fVar261 * auVar111._20_4_;
  auVar165._24_4_ = fVar263 * auVar111._24_4_;
  auVar165._28_4_ = auVar111._28_4_;
  auVar300._16_16_ = auVar27;
  auVar300._0_16_ = auVar102;
  auVar111 = vcvtdq2ps_avx(auVar300);
  auVar111 = vsubps_avx(auVar111,auVar152);
  auVar141._0_4_ = fVar240 * auVar111._0_4_;
  auVar141._4_4_ = fVar257 * auVar111._4_4_;
  auVar141._8_4_ = fVar258 * auVar111._8_4_;
  auVar141._12_4_ = fVar259 * auVar111._12_4_;
  auVar16._16_4_ = fVar260 * auVar111._16_4_;
  auVar16._0_16_ = auVar141;
  auVar16._20_4_ = fVar261 * auVar111._20_4_;
  auVar16._24_4_ = fVar263 * auVar111._24_4_;
  auVar16._28_4_ = auVar111._28_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar97 + uVar94 + 6);
  auVar102 = vpmovsxwd_avx(auVar109);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 + uVar94 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar6);
  auVar248._16_16_ = auVar27;
  auVar248._0_16_ = auVar102;
  auVar111 = vcvtdq2ps_avx(auVar248);
  auVar111 = vsubps_avx(auVar111,auVar179);
  auVar242._0_4_ = fVar220 * auVar111._0_4_;
  auVar242._4_4_ = fVar232 * auVar111._4_4_;
  auVar242._8_4_ = fVar233 * auVar111._8_4_;
  auVar242._12_4_ = fVar234 * auVar111._12_4_;
  auVar19._16_4_ = fVar235 * auVar111._16_4_;
  auVar19._0_16_ = auVar242;
  auVar19._20_4_ = fVar236 * auVar111._20_4_;
  auVar19._24_4_ = fVar238 * auVar111._24_4_;
  auVar19._28_4_ = auVar111._28_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 6);
  auVar102 = vpmovsxwd_avx(auVar7);
  local_928 = prim;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar8);
  auVar301._16_16_ = auVar27;
  auVar301._0_16_ = auVar102;
  auVar111 = vcvtdq2ps_avx(auVar301);
  auVar111 = vsubps_avx(auVar111,auVar179);
  auVar171._0_4_ = fVar220 * auVar111._0_4_;
  auVar171._4_4_ = fVar232 * auVar111._4_4_;
  auVar171._8_4_ = fVar233 * auVar111._8_4_;
  auVar171._12_4_ = fVar234 * auVar111._12_4_;
  auVar117._16_4_ = fVar235 * auVar111._16_4_;
  auVar117._0_16_ = auVar171;
  auVar117._20_4_ = fVar236 * auVar111._20_4_;
  auVar117._24_4_ = fVar238 * auVar111._24_4_;
  auVar117._28_4_ = auVar111._28_4_;
  auVar102 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar27 = vpminsd_avx(auVar100,auVar195);
  auVar321._16_16_ = auVar102;
  auVar321._0_16_ = auVar27;
  auVar106 = auVar165._16_16_;
  auVar360 = ZEXT1664(auVar106);
  auVar102 = vpminsd_avx(auVar106,auVar16._16_16_);
  auVar27 = vpminsd_avx(auVar267,auVar141);
  auVar364._16_16_ = auVar102;
  auVar364._0_16_ = auVar27;
  auVar111 = vmaxps_avx(auVar321,auVar364);
  auVar107 = auVar117._16_16_;
  auVar367 = ZEXT1664(auVar107);
  auVar147 = auVar19._16_16_;
  auVar381 = ZEXT1664(auVar147);
  auVar102 = vpminsd_avx(auVar147,auVar107);
  auVar27 = vpminsd_avx(auVar242,auVar171);
  auVar389._16_16_ = auVar102;
  auVar389._0_16_ = auVar27;
  uVar95 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar399._4_4_ = uVar95;
  auVar399._0_4_ = uVar95;
  auVar399._8_4_ = uVar95;
  auVar399._12_4_ = uVar95;
  auVar399._16_4_ = uVar95;
  auVar399._20_4_ = uVar95;
  auVar399._24_4_ = uVar95;
  auVar399._28_4_ = uVar95;
  auVar165 = vmaxps_avx(auVar389,auVar399);
  auVar111 = vmaxps_avx(auVar111,auVar165);
  local_2c0._4_4_ = auVar111._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar111._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar111._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar111._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar111._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar111._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar111._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar111._28_4_;
  auVar102 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar27 = vpmaxsd_avx(auVar100,auVar195);
  auVar113._16_16_ = auVar102;
  auVar113._0_16_ = auVar27;
  auVar102 = vpmaxsd_avx(auVar106,auVar16._16_16_);
  auVar27 = vpmaxsd_avx(auVar267,auVar141);
  auVar153._16_16_ = auVar102;
  auVar153._0_16_ = auVar27;
  auVar111 = vminps_avx(auVar113,auVar153);
  auVar102 = vpmaxsd_avx(auVar147,auVar107);
  auVar27 = vpmaxsd_avx(auVar242,auVar171);
  fVar194 = (ray->super_RayK<1>).tfar;
  auVar209._4_4_ = fVar194;
  auVar209._0_4_ = fVar194;
  auVar209._8_4_ = fVar194;
  auVar209._12_4_ = fVar194;
  auVar209._16_4_ = fVar194;
  auVar209._20_4_ = fVar194;
  auVar209._24_4_ = fVar194;
  auVar209._28_4_ = fVar194;
  auVar154._16_16_ = auVar102;
  auVar154._0_16_ = auVar27;
  auVar165 = vminps_avx(auVar154,auVar209);
  auVar111 = vminps_avx(auVar111,auVar165);
  auVar28._4_4_ = auVar111._4_4_ * 1.0000004;
  auVar28._0_4_ = auVar111._0_4_ * 1.0000004;
  auVar28._8_4_ = auVar111._8_4_ * 1.0000004;
  auVar28._12_4_ = auVar111._12_4_ * 1.0000004;
  auVar28._16_4_ = auVar111._16_4_ * 1.0000004;
  auVar28._20_4_ = auVar111._20_4_ * 1.0000004;
  auVar28._24_4_ = auVar111._24_4_ * 1.0000004;
  auVar28._28_4_ = auVar111._28_4_;
  auVar111 = vcmpps_avx(local_2c0,auVar28,2);
  auVar102 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar155._16_16_ = auVar102;
  auVar155._0_16_ = auVar102;
  auVar165 = vcvtdq2ps_avx(auVar155);
  auVar165 = vcmpps_avx(_DAT_01faff40,auVar165,1);
  auVar111 = vandps_avx(auVar111,auVar165);
  uVar91 = vmovmskps_avx(auVar111);
  if (uVar91 == 0) {
    return;
  }
  uVar91 = uVar91 & 0xff;
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  local_460 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
LAB_0100fcd2:
  uVar97 = (ulong)uVar91;
  lVar96 = 0;
  if (uVar97 != 0) {
    for (; (uVar91 >> lVar96 & 1) == 0; lVar96 = lVar96 + 1) {
    }
  }
  uVar97 = uVar97 - 1 & uVar97;
  uVar95 = *(undefined4 *)(local_928 + lVar96 * 4 + 6);
  lVar96 = lVar96 * 0x40;
  lVar12 = 0;
  if (uVar97 != 0) {
    for (; (uVar97 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar91 = *(uint *)(local_928 + 2);
  auVar102 = *(undefined1 (*) [16])(prim + lVar96 + lVar79 + 0x16);
  if (((uVar97 != 0) && (uVar94 = uVar97 - 1 & uVar97, uVar94 != 0)) && (lVar12 = 0, uVar94 != 0)) {
    for (; (uVar94 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar27 = *(undefined1 (*) [16])(prim + lVar96 + lVar79 + 0x26);
  auVar107 = *(undefined1 (*) [16])(prim + lVar96 + lVar79 + 0x36);
  auVar147 = *(undefined1 (*) [16])(prim + lVar96 + lVar79 + 0x46);
  auVar101._0_4_ = (auVar102._0_4_ + auVar27._0_4_ + auVar107._0_4_ + auVar147._0_4_) * 0.25;
  auVar101._4_4_ = (auVar102._4_4_ + auVar27._4_4_ + auVar107._4_4_ + auVar147._4_4_) * 0.25;
  auVar101._8_4_ = (auVar102._8_4_ + auVar27._8_4_ + auVar107._8_4_ + auVar147._8_4_) * 0.25;
  auVar101._12_4_ = (auVar102._12_4_ + auVar27._12_4_ + auVar107._12_4_ + auVar147._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar106 = vsubps_avx(auVar101,(undefined1  [16])aVar2);
  auVar106 = vdpps_avx(auVar106,(undefined1  [16])aVar3,0x7f);
  auVar331 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar4 = vrcpss_avx(auVar331,auVar331);
  auVar336 = ZEXT464(0x40000000);
  fVar194 = auVar106._0_4_ * auVar4._0_4_ * (2.0 - auVar4._0_4_ * auVar331._0_4_);
  local_7f0 = ZEXT416((uint)fVar194);
  auVar331 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
  fVar194 = aVar3.x;
  fVar214 = aVar3.y;
  fVar215 = aVar3.z;
  aVar168 = aVar3.field_3;
  auVar268._0_4_ = aVar2.x + fVar194 * auVar331._0_4_;
  auVar268._4_4_ = aVar2.y + fVar214 * auVar331._4_4_;
  auVar268._8_4_ = aVar2.z + fVar215 * auVar331._8_4_;
  auVar268._12_4_ = aVar2.field_3.w + aVar168.w * auVar331._12_4_;
  auVar106 = vblendps_avx(auVar268,_DAT_01f7aa10,8);
  _local_9f0 = vsubps_avx(auVar102,auVar106);
  auVar305 = ZEXT1664(_local_9f0);
  _local_a00 = vsubps_avx(auVar107,auVar106);
  _local_a10 = vsubps_avx(auVar27,auVar106);
  _local_a20 = vsubps_avx(auVar147,auVar106);
  auVar256 = ZEXT1664(_local_a20);
  auVar102 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001290 = auVar102;
  _local_1e0 = auVar102;
  auVar102 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001290 = auVar102;
  _local_200 = auVar102;
  auVar102 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001290 = auVar102;
  _local_220 = auVar102;
  auVar102 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001290 = auVar102;
  _local_240 = auVar102;
  auVar102 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001290 = auVar102;
  _local_260 = auVar102;
  auVar102 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001290 = auVar102;
  _local_280 = auVar102;
  auVar102 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001290 = auVar102;
  _local_320 = auVar102;
  auVar142._0_4_ = fVar194 * fVar194;
  auVar142._4_4_ = fVar214 * fVar214;
  auVar142._8_4_ = fVar215 * fVar215;
  auVar142._12_4_ = aVar168.w * aVar168.w;
  auVar102 = vshufps_avx(auVar142,auVar142,0xaa);
  auVar27 = vshufps_avx(auVar142,auVar142,0x55);
  auVar107 = vshufps_avx(_local_a10,_local_a10,0xff);
  register0x000012d0 = auVar107;
  _local_340 = auVar107;
  auVar107 = vshufps_avx(auVar142,auVar142,0);
  local_2a0._0_4_ = auVar107._0_4_ + auVar27._0_4_ + auVar102._0_4_;
  local_2a0._4_4_ = auVar107._4_4_ + auVar27._4_4_ + auVar102._4_4_;
  local_2a0._8_4_ = auVar107._8_4_ + auVar27._8_4_ + auVar102._8_4_;
  local_2a0._12_4_ = auVar107._12_4_ + auVar27._12_4_ + auVar102._12_4_;
  local_2a0._16_4_ = auVar107._0_4_ + auVar27._0_4_ + auVar102._0_4_;
  local_2a0._20_4_ = auVar107._4_4_ + auVar27._4_4_ + auVar102._4_4_;
  local_2a0._24_4_ = auVar107._8_4_ + auVar27._8_4_ + auVar102._8_4_;
  local_2a0._28_4_ = auVar107._12_4_ + auVar27._12_4_ + auVar102._12_4_;
  auVar280 = ZEXT3264(local_2a0);
  auVar102 = vshufps_avx(_local_a00,_local_a00,0);
  register0x00001250 = auVar102;
  _local_360 = auVar102;
  auVar102 = vshufps_avx(_local_a00,_local_a00,0x55);
  register0x00001250 = auVar102;
  _local_380 = auVar102;
  auVar102 = vshufps_avx(_local_a00,_local_a00,0xaa);
  register0x00001250 = auVar102;
  _local_3a0 = auVar102;
  auVar102 = vshufps_avx(_local_a00,_local_a00,0xff);
  register0x00001250 = auVar102;
  _local_3c0 = auVar102;
  auVar102 = vshufps_avx(_local_a20,_local_a20,0);
  register0x00001250 = auVar102;
  _local_3e0 = auVar102;
  auVar102 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001250 = auVar102;
  _local_400 = auVar102;
  auVar102 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001250 = auVar102;
  _local_420 = auVar102;
  auVar102 = vshufps_avx(_local_a20,_local_a20,0xff);
  local_440._16_16_ = auVar102;
  local_440._0_16_ = auVar102;
  register0x00001210 = auVar331;
  _local_760 = auVar331;
  local_b0c = 1;
  uVar94 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_5a0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_5c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  local_480 = vandps_avx(local_2a0,auVar115);
  local_530 = ZEXT816(0x3f80000000000000);
  do {
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._20_4_ = 0x3f800000;
    iVar98 = (int)uVar94;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar102 = vmovshdup_avx(local_530);
    auVar107 = vsubps_avx(auVar102,local_530);
    auVar102 = vshufps_avx(local_530,local_530,0);
    local_8a0._16_16_ = auVar102;
    local_8a0._0_16_ = auVar102;
    auVar27 = vshufps_avx(auVar107,auVar107,0);
    _fStack_790 = auVar27;
    _local_7a0 = auVar27;
    fVar139 = auVar27._0_4_;
    fVar166 = auVar27._4_4_;
    fVar167 = auVar27._8_4_;
    fVar169 = auVar27._12_4_;
    fVar170 = auVar102._0_4_;
    auVar210._0_4_ = fVar170 + fVar139 * 0.0;
    fVar191 = auVar102._4_4_;
    auVar210._4_4_ = fVar191 + fVar166 * 0.14285715;
    fVar192 = auVar102._8_4_;
    auVar210._8_4_ = fVar192 + fVar167 * 0.2857143;
    fVar193 = auVar102._12_4_;
    auVar210._12_4_ = fVar193 + fVar169 * 0.42857146;
    auVar210._16_4_ = fVar170 + fVar139 * 0.5714286;
    auVar210._20_4_ = fVar191 + fVar166 * 0.71428573;
    auVar210._24_4_ = fVar192 + fVar167 * 0.8571429;
    auVar210._28_4_ = fVar193 + fVar169;
    auVar111 = vsubps_avx(auVar229,auVar210);
    fVar214 = auVar111._0_4_;
    fVar215 = auVar111._4_4_;
    fVar216 = auVar111._8_4_;
    fVar217 = auVar111._12_4_;
    fVar218 = auVar111._16_4_;
    fVar219 = auVar111._20_4_;
    fVar220 = auVar111._24_4_;
    fVar235 = fVar214 * fVar214 * fVar214;
    fVar240 = fVar215 * fVar215 * fVar215;
    fVar258 = fVar216 * fVar216 * fVar216;
    fVar283 = fVar217 * fVar217 * fVar217;
    fVar286 = fVar218 * fVar218 * fVar218;
    fVar289 = fVar219 * fVar219 * fVar219;
    fVar292 = fVar220 * fVar220 * fVar220;
    fVar295 = auVar210._0_4_ * auVar210._0_4_ * auVar210._0_4_;
    fVar306 = auVar210._4_4_ * auVar210._4_4_ * auVar210._4_4_;
    fVar307 = auVar210._8_4_ * auVar210._8_4_ * auVar210._8_4_;
    fVar309 = auVar210._12_4_ * auVar210._12_4_ * auVar210._12_4_;
    fVar311 = auVar210._16_4_ * auVar210._16_4_ * auVar210._16_4_;
    fVar313 = auVar210._20_4_ * auVar210._20_4_ * auVar210._20_4_;
    fVar315 = auVar210._24_4_ * auVar210._24_4_ * auVar210._24_4_;
    fVar194 = auVar256._28_4_;
    fVar232 = auVar210._0_4_ * fVar214;
    fVar233 = auVar210._4_4_ * fVar215;
    fVar234 = auVar210._8_4_ * fVar216;
    fVar238 = auVar210._12_4_ * fVar217;
    fVar260 = auVar210._16_4_ * fVar218;
    fVar261 = auVar210._20_4_ * fVar219;
    fVar263 = auVar210._24_4_ * fVar220;
    fVar236 = auVar360._28_4_ + auVar381._28_4_;
    fVar328 = auVar305._28_4_ + fVar194 + fVar236;
    fVar349 = fVar236 + auVar280._28_4_ + auVar367._28_4_ + auVar336._28_4_;
    fVar236 = fVar235 * 0.16666667;
    fVar257 = fVar240 * 0.16666667;
    fVar259 = fVar258 * 0.16666667;
    fVar284 = fVar283 * 0.16666667;
    fVar287 = fVar286 * 0.16666667;
    fVar290 = fVar289 * 0.16666667;
    fVar293 = fVar292 * 0.16666667;
    fVar317 = (fVar295 + fVar235 * 4.0 + fVar214 * fVar232 * 12.0 + auVar210._0_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar322 = (fVar306 + fVar240 * 4.0 + fVar215 * fVar233 * 12.0 + auVar210._4_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar323 = (fVar307 + fVar258 * 4.0 + fVar216 * fVar234 * 12.0 + auVar210._8_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar324 = (fVar309 + fVar283 * 4.0 + fVar217 * fVar238 * 12.0 + auVar210._12_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar325 = (fVar311 + fVar286 * 4.0 + fVar218 * fVar260 * 12.0 + auVar210._16_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar326 = (fVar313 + fVar289 * 4.0 + fVar219 * fVar261 * 12.0 + auVar210._20_4_ * fVar261 * 6.0)
              * 0.16666667;
    fVar327 = (fVar315 + fVar292 * 4.0 + fVar220 * fVar263 * 12.0 + auVar210._24_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar235 = (fVar295 * 4.0 + fVar235 + auVar210._0_4_ * fVar232 * 12.0 + fVar214 * fVar232 * 6.0)
              * 0.16666667;
    fVar240 = (fVar306 * 4.0 + fVar240 + auVar210._4_4_ * fVar233 * 12.0 + fVar215 * fVar233 * 6.0)
              * 0.16666667;
    fVar258 = (fVar307 * 4.0 + fVar258 + auVar210._8_4_ * fVar234 * 12.0 + fVar216 * fVar234 * 6.0)
              * 0.16666667;
    fVar283 = (fVar309 * 4.0 + fVar283 + auVar210._12_4_ * fVar238 * 12.0 + fVar217 * fVar238 * 6.0)
              * 0.16666667;
    fVar286 = (fVar311 * 4.0 + fVar286 + auVar210._16_4_ * fVar260 * 12.0 + fVar218 * fVar260 * 6.0)
              * 0.16666667;
    fVar289 = (fVar313 * 4.0 + fVar289 + auVar210._20_4_ * fVar261 * 12.0 + fVar219 * fVar261 * 6.0)
              * 0.16666667;
    fVar292 = (fVar315 * 4.0 + fVar292 + auVar210._24_4_ * fVar263 * 12.0 + fVar220 * fVar263 * 6.0)
              * 0.16666667;
    fVar295 = fVar295 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar307 = fVar307 * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar311 = fVar311 * 0.16666667;
    fVar313 = fVar313 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar374 = auVar367._28_4_ + 12.0;
    fVar350 = fVar349 + 12.166667;
    fVar361 = fVar374 + 12.166667;
    local_860 = (float)local_1e0._0_4_ * fVar236 +
                (float)local_260._0_4_ * fVar317 +
                fVar295 * (float)local_3e0._0_4_ + fVar235 * (float)local_360._0_4_;
    fStack_85c = (float)local_1e0._4_4_ * fVar257 +
                 (float)local_260._4_4_ * fVar322 +
                 fVar306 * (float)local_3e0._4_4_ + fVar240 * (float)local_360._4_4_;
    fStack_858 = fStack_1d8 * fVar259 +
                 fStack_258 * fVar323 + fVar307 * fStack_3d8 + fVar258 * fStack_358;
    fStack_854 = fStack_1d4 * fVar284 +
                 fStack_254 * fVar324 + fVar309 * fStack_3d4 + fVar283 * fStack_354;
    fStack_850 = fStack_1d0 * fVar287 +
                 fStack_250 * fVar325 + fVar311 * fStack_3d0 + fVar286 * fStack_350;
    fStack_84c = fStack_1cc * fVar290 +
                 fStack_24c * fVar326 + fVar313 * fStack_3cc + fVar289 * fStack_34c;
    fStack_848 = fStack_1c8 * fVar293 +
                 fStack_248 * fVar327 + fVar315 * fStack_3c8 + fVar292 * fStack_348;
    fStack_844 = fVar328 + fVar350;
    fVar99 = (float)local_200._0_4_ * fVar236 +
             (float)local_280._0_4_ * fVar317 +
             fVar295 * (float)local_400._0_4_ + fVar235 * (float)local_380._0_4_;
    fVar126 = (float)local_200._4_4_ * fVar257 +
              (float)local_280._4_4_ * fVar322 +
              fVar306 * (float)local_400._4_4_ + fVar240 * (float)local_380._4_4_;
    fVar128 = fStack_1f8 * fVar259 +
              fStack_278 * fVar323 + fVar307 * fStack_3f8 + fVar258 * fStack_378;
    fVar130 = fStack_1f4 * fVar284 +
              fStack_274 * fVar324 + fVar309 * fStack_3f4 + fVar283 * fStack_374;
    fVar132 = fStack_1f0 * fVar287 +
              fStack_270 * fVar325 + fVar311 * fStack_3f0 + fVar286 * fStack_370;
    fVar134 = fStack_1ec * fVar290 +
              fStack_26c * fVar326 + fVar313 * fStack_3ec + fVar289 * fStack_36c;
    fVar136 = fStack_1e8 * fVar293 +
              fStack_268 * fVar327 + fVar315 * fStack_3e8 + fVar292 * fStack_368;
    fVar138 = fVar328 + fVar361;
    local_840 = (float)local_220._0_4_ * fVar236 +
                fVar317 * (float)local_320._0_4_ +
                fVar295 * (float)local_420._0_4_ + fVar235 * (float)local_3a0._0_4_;
    fStack_83c = (float)local_220._4_4_ * fVar257 +
                 fVar322 * (float)local_320._4_4_ +
                 fVar306 * (float)local_420._4_4_ + fVar240 * (float)local_3a0._4_4_;
    fStack_838 = fStack_218 * fVar259 +
                 fVar323 * fStack_318 + fVar307 * fStack_418 + fVar258 * fStack_398;
    aStack_834.w = fStack_214 * fVar284 +
                   fVar324 * fStack_314 + fVar309 * fStack_414 + fVar283 * fStack_394;
    fStack_830 = fStack_210 * fVar287 +
                 fVar325 * fStack_310 + fVar311 * fStack_410 + fVar286 * fStack_390;
    fStack_82c = fStack_20c * fVar290 +
                 fVar326 * fStack_30c + fVar313 * fStack_40c + fVar289 * fStack_38c;
    fStack_828 = fStack_208 * fVar293 +
                 fVar327 * fStack_308 + fVar315 * fStack_408 + fVar292 * fStack_388;
    fStack_824 = fVar328 + fVar374 + auVar381._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_240._0_4_ * fVar236 +
         fVar317 * (float)local_340._0_4_ +
         fVar235 * (float)local_3c0._0_4_ + local_440._0_4_ * fVar295;
    local_ae0._4_4_ =
         (float)local_240._4_4_ * fVar257 +
         fVar322 * (float)local_340._4_4_ +
         fVar240 * (float)local_3c0._4_4_ + local_440._4_4_ * fVar306;
    fStack_ad8 = fStack_238 * fVar259 +
                 fVar323 * fStack_338 + fVar258 * fStack_3b8 + local_440._8_4_ * fVar307;
    fStack_ad4 = fStack_234 * fVar284 +
                 fVar324 * fStack_334 + fVar283 * fStack_3b4 + local_440._12_4_ * fVar309;
    fStack_ad0 = fStack_230 * fVar287 +
                 fVar325 * fStack_330 + fVar286 * fStack_3b0 + local_440._16_4_ * fVar311;
    fStack_acc = fStack_22c * fVar290 +
                 fVar326 * fStack_32c + fVar289 * fStack_3ac + local_440._20_4_ * fVar313;
    fStack_ac8 = fStack_228 * fVar293 +
                 fVar327 * fStack_328 + fVar292 * fStack_3a8 + local_440._24_4_ * fVar315;
    fStack_ac4 = auVar280._28_4_ + fVar328 + fVar349 + auVar305._28_4_;
    auVar29._4_4_ = auVar210._4_4_ * -auVar210._4_4_;
    auVar29._0_4_ = auVar210._0_4_ * -auVar210._0_4_;
    auVar29._8_4_ = auVar210._8_4_ * -auVar210._8_4_;
    auVar29._12_4_ = auVar210._12_4_ * -auVar210._12_4_;
    auVar29._16_4_ = auVar210._16_4_ * -auVar210._16_4_;
    auVar29._20_4_ = auVar210._20_4_ * -auVar210._20_4_;
    auVar29._24_4_ = auVar210._24_4_ * -auVar210._24_4_;
    auVar29._28_4_ = auVar210._28_4_;
    auVar30._4_4_ = fVar233 * 4.0;
    auVar30._0_4_ = fVar232 * 4.0;
    auVar30._8_4_ = fVar234 * 4.0;
    auVar30._12_4_ = fVar238 * 4.0;
    auVar30._16_4_ = fVar260 * 4.0;
    auVar30._20_4_ = fVar261 * 4.0;
    auVar30._24_4_ = fVar263 * 4.0;
    auVar30._28_4_ = fVar194;
    auVar111 = vsubps_avx(auVar29,auVar30);
    fVar292 = fVar214 * -fVar214 * 0.5;
    fVar293 = fVar215 * -fVar215 * 0.5;
    fVar295 = fVar216 * -fVar216 * 0.5;
    fVar306 = fVar217 * -fVar217 * 0.5;
    fVar307 = fVar218 * -fVar218 * 0.5;
    fVar309 = fVar219 * -fVar219 * 0.5;
    fVar311 = fVar220 * -fVar220 * 0.5;
    fVar240 = auVar111._0_4_ * 0.5;
    fVar257 = auVar111._4_4_ * 0.5;
    fVar283 = auVar111._8_4_ * 0.5;
    fVar286 = auVar111._12_4_ * 0.5;
    fVar287 = auVar111._16_4_ * 0.5;
    fVar289 = auVar111._20_4_ * 0.5;
    fVar290 = auVar111._24_4_ * 0.5;
    fVar235 = (fVar214 * fVar214 + fVar232 * 4.0) * 0.5;
    fVar236 = (fVar215 * fVar215 + fVar233 * 4.0) * 0.5;
    fVar258 = (fVar216 * fVar216 + fVar234 * 4.0) * 0.5;
    fVar259 = (fVar217 * fVar217 + fVar238 * 4.0) * 0.5;
    fVar260 = (fVar218 * fVar218 + fVar260 * 4.0) * 0.5;
    fVar261 = (fVar219 * fVar219 + fVar261 * 4.0) * 0.5;
    fVar263 = (fVar220 * fVar220 + fVar263 * 4.0) * 0.5;
    fVar214 = auVar210._0_4_ * auVar210._0_4_ * 0.5;
    fVar215 = auVar210._4_4_ * auVar210._4_4_ * 0.5;
    fVar216 = auVar210._8_4_ * auVar210._8_4_ * 0.5;
    fVar217 = auVar210._12_4_ * auVar210._12_4_ * 0.5;
    fVar232 = auVar210._16_4_ * auVar210._16_4_ * 0.5;
    fVar233 = auVar210._20_4_ * auVar210._20_4_ * 0.5;
    fVar234 = auVar210._24_4_ * auVar210._24_4_ * 0.5;
    fVar284 = auVar111._28_4_ + fVar193 + fVar194 + fVar350 + fVar194;
    auVar102 = vpermilps_avx(ZEXT416((uint)(auVar107._0_4_ * 0.04761905)),0);
    fVar218 = auVar102._0_4_;
    fVar375 = fVar218 * ((float)local_1e0._0_4_ * fVar292 +
                        (float)local_260._0_4_ * fVar240 +
                        fVar235 * (float)local_360._0_4_ + fVar214 * (float)local_3e0._0_4_);
    fVar219 = auVar102._4_4_;
    fVar382 = fVar219 * ((float)local_1e0._4_4_ * fVar293 +
                        (float)local_260._4_4_ * fVar257 +
                        fVar236 * (float)local_360._4_4_ + fVar215 * (float)local_3e0._4_4_);
    local_980._4_4_ = fVar382;
    local_980._0_4_ = fVar375;
    fVar220 = auVar102._8_4_;
    fVar383 = fVar220 * (fStack_1d8 * fVar295 +
                        fStack_258 * fVar283 + fVar258 * fStack_358 + fVar216 * fStack_3d8);
    local_980._8_4_ = fVar383;
    fVar238 = auVar102._12_4_;
    fVar384 = fVar238 * (fStack_1d4 * fVar306 +
                        fStack_254 * fVar286 + fVar259 * fStack_354 + fVar217 * fStack_3d4);
    local_980._12_4_ = fVar384;
    fVar385 = fVar218 * (fStack_1d0 * fVar307 +
                        fStack_250 * fVar287 + fVar260 * fStack_350 + fVar232 * fStack_3d0);
    local_980._16_4_ = fVar385;
    fVar386 = fVar219 * (fStack_1cc * fVar309 +
                        fStack_24c * fVar289 + fVar261 * fStack_34c + fVar233 * fStack_3cc);
    local_980._20_4_ = fVar386;
    fVar387 = fVar220 * (fStack_1c8 * fVar311 +
                        fStack_248 * fVar290 + fVar263 * fStack_348 + fVar234 * fStack_3c8);
    local_980._24_4_ = fVar387;
    local_980._28_4_ = uStack_1c4;
    fVar362 = fVar218 * ((float)local_200._0_4_ * fVar292 +
                        (float)local_280._0_4_ * fVar240 +
                        fVar235 * (float)local_380._0_4_ + fVar214 * (float)local_400._0_4_);
    fVar368 = fVar219 * ((float)local_200._4_4_ * fVar293 +
                        (float)local_280._4_4_ * fVar257 +
                        fVar236 * (float)local_380._4_4_ + fVar215 * (float)local_400._4_4_);
    local_8c0._4_4_ = fVar368;
    local_8c0._0_4_ = fVar362;
    fVar369 = fVar220 * (fStack_1f8 * fVar295 +
                        fStack_278 * fVar283 + fVar258 * fStack_378 + fVar216 * fStack_3f8);
    local_8c0._8_4_ = fVar369;
    fVar370 = fVar238 * (fStack_1f4 * fVar306 +
                        fStack_274 * fVar286 + fVar259 * fStack_374 + fVar217 * fStack_3f4);
    local_8c0._12_4_ = fVar370;
    fVar371 = fVar218 * (fStack_1f0 * fVar307 +
                        fStack_270 * fVar287 + fVar260 * fStack_370 + fVar232 * fStack_3f0);
    local_8c0._16_4_ = fVar371;
    fVar372 = fVar219 * (fStack_1ec * fVar309 +
                        fStack_26c * fVar289 + fVar261 * fStack_36c + fVar233 * fStack_3ec);
    local_8c0._20_4_ = fVar372;
    fVar373 = fVar220 * (fStack_1e8 * fVar311 +
                        fStack_268 * fVar290 + fVar263 * fStack_368 + fVar234 * fStack_3e8);
    local_8c0._24_4_ = fVar373;
    local_8c0._28_4_ = uStack_224;
    fVar329 = fVar218 * ((float)local_220._0_4_ * fVar292 +
                        fVar214 * (float)local_420._0_4_ + fVar235 * (float)local_3a0._0_4_ +
                        fVar240 * (float)local_320._0_4_);
    fVar337 = fVar219 * ((float)local_220._4_4_ * fVar293 +
                        fVar215 * (float)local_420._4_4_ + fVar236 * (float)local_3a0._4_4_ +
                        fVar257 * (float)local_320._4_4_);
    local_9e0._4_4_ = fVar337;
    local_9e0._0_4_ = fVar329;
    fVar339 = fVar220 * (fStack_218 * fVar295 +
                        fVar216 * fStack_418 + fVar258 * fStack_398 + fVar283 * fStack_318);
    local_9e0._8_4_ = fVar339;
    fVar341 = fVar238 * (fStack_214 * fVar306 +
                        fVar217 * fStack_414 + fVar259 * fStack_394 + fVar286 * fStack_314);
    local_9e0._12_4_ = fVar341;
    fVar343 = fVar218 * (fStack_210 * fVar307 +
                        fVar232 * fStack_410 + fVar260 * fStack_390 + fVar287 * fStack_310);
    local_9e0._16_4_ = fVar343;
    fVar345 = fVar219 * (fStack_20c * fVar309 +
                        fVar233 * fStack_40c + fVar261 * fStack_38c + fVar289 * fStack_30c);
    local_9e0._20_4_ = fVar345;
    fVar347 = fVar220 * (fStack_208 * fVar311 +
                        fVar234 * fStack_408 + fVar263 * fStack_388 + fVar290 * fStack_308);
    local_9e0._24_4_ = fVar347;
    local_9e0._28_4_ = fVar350;
    fVar240 = fVar218 * ((float)local_240._0_4_ * fVar292 +
                        fVar240 * (float)local_340._0_4_ +
                        fVar214 * local_440._0_4_ + fVar235 * (float)local_3c0._0_4_);
    fVar257 = fVar219 * ((float)local_240._4_4_ * fVar293 +
                        fVar257 * (float)local_340._4_4_ +
                        fVar215 * local_440._4_4_ + fVar236 * (float)local_3c0._4_4_);
    auVar31._4_4_ = fVar257;
    auVar31._0_4_ = fVar240;
    fVar283 = fVar220 * (fStack_238 * fVar295 +
                        fVar283 * fStack_338 + fVar216 * local_440._8_4_ + fVar258 * fStack_3b8);
    auVar31._8_4_ = fVar283;
    fVar238 = fVar238 * (fStack_234 * fVar306 +
                        fVar286 * fStack_334 + fVar217 * local_440._12_4_ + fVar259 * fStack_3b4);
    auVar31._12_4_ = fVar238;
    fVar218 = fVar218 * (fStack_230 * fVar307 +
                        fVar287 * fStack_330 + fVar232 * local_440._16_4_ + fVar260 * fStack_3b0);
    auVar31._16_4_ = fVar218;
    fVar219 = fVar219 * (fStack_22c * fVar309 +
                        fVar289 * fStack_32c + fVar233 * local_440._20_4_ + fVar261 * fStack_3ac);
    auVar31._20_4_ = fVar219;
    fVar220 = fVar220 * (fStack_228 * fVar311 +
                        fVar290 * fStack_328 + fVar234 * local_440._24_4_ + fVar263 * fStack_3a8);
    auVar31._24_4_ = fVar220;
    auVar31._28_4_ = fVar284;
    auVar80._4_4_ = fVar126;
    auVar80._0_4_ = fVar99;
    auVar80._8_4_ = fVar128;
    auVar80._12_4_ = fVar130;
    auVar80._16_4_ = fVar132;
    auVar80._20_4_ = fVar134;
    auVar80._24_4_ = fVar136;
    auVar80._28_4_ = fVar138;
    auVar111 = vperm2f128_avx(auVar80,auVar80,1);
    auVar111 = vshufps_avx(auVar111,auVar80,0x30);
    local_880 = vshufps_avx(auVar80,auVar111,0x29);
    auVar85._4_4_ = fStack_83c;
    auVar85._0_4_ = local_840;
    auVar85._8_4_ = fStack_838;
    auVar85._12_4_ = aStack_834;
    auVar85._16_4_ = fStack_830;
    auVar85._20_4_ = fStack_82c;
    auVar85._24_4_ = fStack_828;
    auVar85._28_4_ = fStack_824;
    auVar111 = vperm2f128_avx(auVar85,auVar85,1);
    auVar111 = vshufps_avx(auVar111,auVar85,0x30);
    local_a40 = vshufps_avx(auVar85,auVar111,0x29);
    auVar165 = vsubps_avx(_local_ae0,auVar31);
    auVar111 = vperm2f128_avx(auVar165,auVar165,1);
    auVar111 = vshufps_avx(auVar111,auVar165,0x30);
    local_7c0 = vshufps_avx(auVar165,auVar111,0x29);
    local_600 = vsubps_avx(local_880,auVar80);
    local_5e0 = vsubps_avx(local_a40,auVar85);
    fVar214 = local_600._0_4_;
    fVar233 = local_600._4_4_;
    auVar32._4_4_ = fVar337 * fVar233;
    auVar32._0_4_ = fVar329 * fVar214;
    fVar259 = local_600._8_4_;
    auVar32._8_4_ = fVar339 * fVar259;
    fVar289 = local_600._12_4_;
    auVar32._12_4_ = fVar341 * fVar289;
    fVar311 = local_600._16_4_;
    auVar32._16_4_ = fVar343 * fVar311;
    fVar326 = local_600._20_4_;
    auVar32._20_4_ = fVar345 * fVar326;
    fVar20 = local_600._24_4_;
    auVar32._24_4_ = fVar347 * fVar20;
    auVar32._28_4_ = auVar165._28_4_;
    fVar215 = local_5e0._0_4_;
    fVar234 = local_5e0._4_4_;
    auVar33._4_4_ = fVar368 * fVar234;
    auVar33._0_4_ = fVar362 * fVar215;
    fVar260 = local_5e0._8_4_;
    auVar33._8_4_ = fVar369 * fVar260;
    fVar290 = local_5e0._12_4_;
    auVar33._12_4_ = fVar370 * fVar290;
    fVar313 = local_5e0._16_4_;
    auVar33._16_4_ = fVar371 * fVar313;
    fVar327 = local_5e0._20_4_;
    auVar33._20_4_ = fVar372 * fVar327;
    fVar21 = local_5e0._24_4_;
    auVar33._24_4_ = fVar373 * fVar21;
    auVar33._28_4_ = auVar111._28_4_;
    auVar15 = vsubps_avx(auVar33,auVar32);
    auVar82._4_4_ = fStack_85c;
    auVar82._0_4_ = local_860;
    auVar82._8_4_ = fStack_858;
    auVar82._12_4_ = fStack_854;
    auVar82._16_4_ = fStack_850;
    auVar82._20_4_ = fStack_84c;
    auVar82._24_4_ = fStack_848;
    auVar82._28_4_ = fStack_844;
    auVar111 = vperm2f128_avx(auVar82,auVar82,1);
    auVar111 = vshufps_avx(auVar111,auVar82,0x30);
    local_9c0 = vshufps_avx(auVar82,auVar111,0x29);
    _local_720 = vsubps_avx(local_9c0,auVar82);
    auVar34._4_4_ = fVar382 * fVar234;
    auVar34._0_4_ = fVar375 * fVar215;
    auVar34._8_4_ = fVar383 * fVar260;
    auVar34._12_4_ = fVar384 * fVar290;
    auVar34._16_4_ = fVar385 * fVar313;
    auVar34._20_4_ = fVar386 * fVar327;
    auVar34._24_4_ = fVar387 * fVar21;
    auVar34._28_4_ = local_9c0._28_4_;
    fVar216 = local_720._0_4_;
    fVar235 = local_720._4_4_;
    auVar35._4_4_ = fVar337 * fVar235;
    auVar35._0_4_ = fVar329 * fVar216;
    fVar261 = local_720._8_4_;
    auVar35._8_4_ = fVar339 * fVar261;
    fVar292 = local_720._12_4_;
    auVar35._12_4_ = fVar341 * fVar292;
    fVar315 = local_720._16_4_;
    auVar35._16_4_ = fVar343 * fVar315;
    fVar328 = local_720._20_4_;
    auVar35._20_4_ = fVar345 * fVar328;
    fVar22 = local_720._24_4_;
    auVar35._24_4_ = fVar347 * fVar22;
    auVar35._28_4_ = local_880._28_4_;
    auVar16 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar368 * fVar235;
    auVar36._0_4_ = fVar362 * fVar216;
    auVar36._8_4_ = fVar369 * fVar261;
    auVar36._12_4_ = fVar370 * fVar292;
    auVar36._16_4_ = fVar371 * fVar315;
    auVar36._20_4_ = fVar372 * fVar328;
    auVar36._24_4_ = fVar373 * fVar22;
    auVar36._28_4_ = local_880._28_4_;
    auVar37._4_4_ = fVar382 * fVar233;
    auVar37._0_4_ = fVar375 * fVar214;
    auVar37._8_4_ = fVar383 * fVar259;
    auVar37._12_4_ = fVar384 * fVar289;
    auVar37._16_4_ = fVar385 * fVar311;
    auVar37._20_4_ = fVar386 * fVar326;
    auVar37._24_4_ = fVar387 * fVar20;
    auVar37._28_4_ = fVar361;
    auVar17 = vsubps_avx(auVar37,auVar36);
    fVar194 = auVar17._28_4_;
    auVar156._0_4_ = fVar216 * fVar216 + fVar214 * fVar214 + fVar215 * fVar215;
    auVar156._4_4_ = fVar235 * fVar235 + fVar233 * fVar233 + fVar234 * fVar234;
    auVar156._8_4_ = fVar261 * fVar261 + fVar259 * fVar259 + fVar260 * fVar260;
    auVar156._12_4_ = fVar292 * fVar292 + fVar289 * fVar289 + fVar290 * fVar290;
    auVar156._16_4_ = fVar315 * fVar315 + fVar311 * fVar311 + fVar313 * fVar313;
    auVar156._20_4_ = fVar328 * fVar328 + fVar326 * fVar326 + fVar327 * fVar327;
    auVar156._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar156._28_4_ = fVar194 + fVar194 + auVar15._28_4_;
    auVar111 = vrcpps_avx(auVar156);
    fVar286 = auVar111._0_4_;
    fVar287 = auVar111._4_4_;
    auVar38._4_4_ = fVar287 * auVar156._4_4_;
    auVar38._0_4_ = fVar286 * auVar156._0_4_;
    fVar295 = auVar111._8_4_;
    auVar38._8_4_ = fVar295 * auVar156._8_4_;
    fVar306 = auVar111._12_4_;
    auVar38._12_4_ = fVar306 * auVar156._12_4_;
    fVar307 = auVar111._16_4_;
    auVar38._16_4_ = fVar307 * auVar156._16_4_;
    fVar309 = auVar111._20_4_;
    auVar38._20_4_ = fVar309 * auVar156._20_4_;
    fVar322 = auVar111._24_4_;
    auVar38._24_4_ = fVar322 * auVar156._24_4_;
    auVar38._28_4_ = fVar361;
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar157 = vsubps_avx(auVar116,auVar38);
    fVar286 = auVar157._0_4_ * fVar286 + fVar286;
    fVar287 = auVar157._4_4_ * fVar287 + fVar287;
    fVar295 = auVar157._8_4_ * fVar295 + fVar295;
    fVar306 = auVar157._12_4_ * fVar306 + fVar306;
    fVar307 = auVar157._16_4_ * fVar307 + fVar307;
    fVar309 = auVar157._20_4_ * fVar309 + fVar309;
    fVar322 = auVar157._24_4_ * fVar322 + fVar322;
    auVar165 = vperm2f128_avx(local_8c0,local_8c0,1);
    auVar165 = vshufps_avx(auVar165,local_8c0,0x30);
    local_9a0 = vshufps_avx(local_8c0,auVar165,0x29);
    auVar165 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar165 = vshufps_avx(auVar165,local_9e0,0x30);
    local_820 = vshufps_avx(local_9e0,auVar165,0x29);
    fVar217 = local_820._0_4_;
    fVar236 = local_820._4_4_;
    auVar39._4_4_ = fVar233 * fVar236;
    auVar39._0_4_ = fVar214 * fVar217;
    fVar263 = local_820._8_4_;
    auVar39._8_4_ = fVar259 * fVar263;
    fVar293 = local_820._12_4_;
    auVar39._12_4_ = fVar289 * fVar293;
    fVar317 = local_820._16_4_;
    auVar39._16_4_ = fVar311 * fVar317;
    fVar349 = local_820._20_4_;
    auVar39._20_4_ = fVar326 * fVar349;
    fVar23 = local_820._24_4_;
    auVar39._24_4_ = fVar20 * fVar23;
    auVar39._28_4_ = auVar165._28_4_;
    fVar388 = local_9a0._0_4_;
    fVar393 = local_9a0._4_4_;
    auVar40._4_4_ = fVar393 * fVar234;
    auVar40._0_4_ = fVar388 * fVar215;
    fVar394 = local_9a0._8_4_;
    auVar40._8_4_ = fVar394 * fVar260;
    fVar395 = local_9a0._12_4_;
    auVar40._12_4_ = fVar395 * fVar290;
    fVar396 = local_9a0._16_4_;
    auVar40._16_4_ = fVar396 * fVar313;
    fVar397 = local_9a0._20_4_;
    auVar40._20_4_ = fVar397 * fVar327;
    fVar398 = local_9a0._24_4_;
    auVar40._24_4_ = fVar398 * fVar21;
    auVar40._28_4_ = uStack_224;
    auVar181 = vsubps_avx(auVar40,auVar39);
    auVar165 = vperm2f128_avx(local_980,local_980,1);
    auVar165 = vshufps_avx(auVar165,local_980,0x30);
    local_8e0 = vshufps_avx(local_980,auVar165,0x29);
    fVar330 = local_8e0._0_4_;
    fVar338 = local_8e0._4_4_;
    auVar41._4_4_ = fVar338 * fVar234;
    auVar41._0_4_ = fVar330 * fVar215;
    fVar340 = local_8e0._8_4_;
    auVar41._8_4_ = fVar340 * fVar260;
    fVar342 = local_8e0._12_4_;
    auVar41._12_4_ = fVar342 * fVar290;
    fVar344 = local_8e0._16_4_;
    auVar41._16_4_ = fVar344 * fVar313;
    fVar346 = local_8e0._20_4_;
    auVar41._20_4_ = fVar346 * fVar327;
    fVar348 = local_8e0._24_4_;
    auVar41._24_4_ = fVar348 * fVar21;
    auVar41._28_4_ = auVar165._28_4_;
    auVar19 = local_820;
    auVar42._4_4_ = fVar236 * fVar235;
    auVar42._0_4_ = fVar217 * fVar216;
    auVar42._8_4_ = fVar263 * fVar261;
    auVar42._12_4_ = fVar293 * fVar292;
    auVar42._16_4_ = fVar317 * fVar315;
    auVar42._20_4_ = fVar349 * fVar328;
    auVar42._24_4_ = fVar23 * fVar22;
    auVar42._28_4_ = uStack_1c4;
    auVar18 = vsubps_avx(auVar42,auVar41);
    auVar43._4_4_ = fVar393 * fVar235;
    auVar43._0_4_ = fVar388 * fVar216;
    auVar43._8_4_ = fVar394 * fVar261;
    auVar43._12_4_ = fVar395 * fVar292;
    auVar43._16_4_ = fVar396 * fVar315;
    auVar43._20_4_ = fVar397 * fVar328;
    auVar43._24_4_ = fVar398 * fVar22;
    auVar43._28_4_ = uStack_1c4;
    auVar44._4_4_ = fVar338 * fVar233;
    auVar44._0_4_ = fVar330 * fVar214;
    auVar44._8_4_ = fVar340 * fVar259;
    auVar44._12_4_ = fVar342 * fVar289;
    auVar44._16_4_ = fVar344 * fVar311;
    auVar44._20_4_ = fVar346 * fVar326;
    fVar232 = local_9a0._28_4_;
    auVar44._24_4_ = fVar348 * fVar20;
    auVar44._28_4_ = fVar232;
    auVar165 = vsubps_avx(auVar44,auVar43);
    fVar258 = auVar165._28_4_;
    auVar45._4_4_ =
         (auVar15._4_4_ * auVar15._4_4_ +
         auVar16._4_4_ * auVar16._4_4_ + auVar17._4_4_ * auVar17._4_4_) * fVar287;
    auVar45._0_4_ =
         (auVar15._0_4_ * auVar15._0_4_ +
         auVar16._0_4_ * auVar16._0_4_ + auVar17._0_4_ * auVar17._0_4_) * fVar286;
    auVar45._8_4_ =
         (auVar15._8_4_ * auVar15._8_4_ +
         auVar16._8_4_ * auVar16._8_4_ + auVar17._8_4_ * auVar17._8_4_) * fVar295;
    auVar45._12_4_ =
         (auVar15._12_4_ * auVar15._12_4_ +
         auVar16._12_4_ * auVar16._12_4_ + auVar17._12_4_ * auVar17._12_4_) * fVar306;
    auVar45._16_4_ =
         (auVar15._16_4_ * auVar15._16_4_ +
         auVar16._16_4_ * auVar16._16_4_ + auVar17._16_4_ * auVar17._16_4_) * fVar307;
    auVar45._20_4_ =
         (auVar15._20_4_ * auVar15._20_4_ +
         auVar16._20_4_ * auVar16._20_4_ + auVar17._20_4_ * auVar17._20_4_) * fVar309;
    auVar45._24_4_ =
         (auVar15._24_4_ * auVar15._24_4_ +
         auVar16._24_4_ * auVar16._24_4_ + auVar17._24_4_ * auVar17._24_4_) * fVar322;
    auVar45._28_4_ = auVar15._28_4_ + auVar16._28_4_ + fVar194;
    auVar46._4_4_ =
         (auVar181._4_4_ * auVar181._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar165._4_4_ * auVar165._4_4_) * fVar287;
    auVar46._0_4_ =
         (auVar181._0_4_ * auVar181._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar165._0_4_ * auVar165._0_4_) * fVar286;
    auVar46._8_4_ =
         (auVar181._8_4_ * auVar181._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar165._8_4_ * auVar165._8_4_) * fVar295;
    auVar46._12_4_ =
         (auVar181._12_4_ * auVar181._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar165._12_4_ * auVar165._12_4_) * fVar306;
    auVar46._16_4_ =
         (auVar181._16_4_ * auVar181._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar165._16_4_ * auVar165._16_4_) * fVar307;
    auVar46._20_4_ =
         (auVar181._20_4_ * auVar181._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar165._20_4_ * auVar165._20_4_) * fVar309;
    auVar46._24_4_ =
         (auVar181._24_4_ * auVar181._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar165._24_4_ * auVar165._24_4_) * fVar322;
    auVar46._28_4_ = auVar157._28_4_ + auVar111._28_4_;
    auVar111 = vmaxps_avx(auVar45,auVar46);
    auVar165 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar165 = vshufps_avx(auVar165,_local_ae0,0x30);
    _local_7e0 = vshufps_avx(_local_ae0,auVar165,0x29);
    local_6c0._0_4_ = (float)local_ae0._0_4_ + fVar240;
    local_6c0._4_4_ = (float)local_ae0._4_4_ + fVar257;
    fStack_6b8 = fStack_ad8 + fVar283;
    fStack_6b4 = fStack_ad4 + fVar238;
    fStack_6b0 = fStack_ad0 + fVar218;
    fStack_6ac = fStack_acc + fVar219;
    fStack_6a8 = fStack_ac8 + fVar220;
    register0x0000121c = fStack_ac4 + fVar284;
    auVar165 = vmaxps_avx(_local_ae0,_local_6c0);
    auVar15 = vmaxps_avx(local_7c0,_local_7e0);
    auVar165 = vmaxps_avx(auVar165,auVar15);
    auVar15 = vrsqrtps_avx(auVar156);
    fVar194 = auVar15._0_4_;
    fVar218 = auVar15._4_4_;
    fVar219 = auVar15._8_4_;
    fVar220 = auVar15._12_4_;
    fVar238 = auVar15._16_4_;
    fVar240 = auVar15._20_4_;
    fVar257 = auVar15._24_4_;
    auVar47._4_4_ = fVar218 * fVar218 * fVar218 * auVar156._4_4_ * 0.5;
    auVar47._0_4_ = fVar194 * fVar194 * fVar194 * auVar156._0_4_ * 0.5;
    auVar47._8_4_ = fVar219 * fVar219 * fVar219 * auVar156._8_4_ * 0.5;
    auVar47._12_4_ = fVar220 * fVar220 * fVar220 * auVar156._12_4_ * 0.5;
    auVar47._16_4_ = fVar238 * fVar238 * fVar238 * auVar156._16_4_ * 0.5;
    auVar47._20_4_ = fVar240 * fVar240 * fVar240 * auVar156._20_4_ * 0.5;
    auVar47._24_4_ = fVar257 * fVar257 * fVar257 * auVar156._24_4_ * 0.5;
    auVar47._28_4_ = auVar156._28_4_;
    auVar48._4_4_ = fVar218 * 1.5;
    auVar48._0_4_ = fVar194 * 1.5;
    auVar48._8_4_ = fVar219 * 1.5;
    auVar48._12_4_ = fVar220 * 1.5;
    auVar48._16_4_ = fVar238 * 1.5;
    auVar48._20_4_ = fVar240 * 1.5;
    auVar48._24_4_ = fVar257 * 1.5;
    auVar48._28_4_ = auVar15._28_4_;
    auVar16 = vsubps_avx(auVar48,auVar47);
    auVar81._4_4_ = fVar126;
    auVar81._0_4_ = fVar99;
    auVar81._8_4_ = fVar128;
    auVar81._12_4_ = fVar130;
    auVar81._16_4_ = fVar132;
    auVar81._20_4_ = fVar134;
    auVar81._24_4_ = fVar136;
    auVar81._28_4_ = fVar138;
    _local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    local_780 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar218 = local_780._0_4_;
    fVar238 = local_780._4_4_;
    fVar283 = local_780._8_4_;
    fVar295 = local_780._12_4_;
    fVar322 = local_780._16_4_;
    fVar350 = local_780._20_4_;
    fVar24 = local_780._24_4_;
    auVar14._4_4_ = fStack_59c;
    auVar14._0_4_ = local_5a0;
    auVar14._8_4_ = fStack_598;
    auVar14._12_4_ = fStack_594;
    auVar14._16_4_ = fStack_590;
    auVar14._20_4_ = fStack_58c;
    auVar14._24_4_ = fStack_588;
    auVar14._28_4_ = fStack_584;
    fVar219 = local_a60._0_4_;
    fVar240 = local_a60._4_4_;
    fVar284 = local_a60._8_4_;
    fVar306 = local_a60._12_4_;
    fVar323 = local_a60._16_4_;
    fVar361 = local_a60._20_4_;
    fVar25 = local_a60._24_4_;
    auVar17 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    fVar220 = auVar17._0_4_;
    fVar257 = auVar17._4_4_;
    fVar286 = auVar17._8_4_;
    fVar307 = auVar17._12_4_;
    fVar324 = auVar17._16_4_;
    fVar374 = auVar17._20_4_;
    fVar26 = auVar17._24_4_;
    auVar352._0_4_ = local_580 * fVar220 + local_5a0 * fVar219 + local_5c0 * fVar218;
    auVar352._4_4_ = fStack_57c * fVar257 + fStack_59c * fVar240 + fStack_5bc * fVar238;
    auVar352._8_4_ = fStack_578 * fVar286 + fStack_598 * fVar284 + fStack_5b8 * fVar283;
    auVar352._12_4_ = fStack_574 * fVar307 + fStack_594 * fVar306 + fStack_5b4 * fVar295;
    auVar352._16_4_ = fStack_570 * fVar324 + fStack_590 * fVar323 + fStack_5b0 * fVar322;
    auVar352._20_4_ = fStack_56c * fVar374 + fStack_58c * fVar361 + fStack_5ac * fVar350;
    auVar352._24_4_ = fStack_568 * fVar26 + fStack_588 * fVar25 + fStack_5a8 * fVar24;
    auVar352._28_4_ = fVar258 + auVar181._28_4_ + auVar18._28_4_ + fVar258 + auVar15._28_4_;
    auVar377._0_4_ = fVar220 * fVar220 + fVar219 * fVar219 + fVar218 * fVar218;
    auVar377._4_4_ = fVar257 * fVar257 + fVar240 * fVar240 + fVar238 * fVar238;
    auVar377._8_4_ = fVar286 * fVar286 + fVar284 * fVar284 + fVar283 * fVar283;
    auVar377._12_4_ = fVar307 * fVar307 + fVar306 * fVar306 + fVar295 * fVar295;
    auVar377._16_4_ = fVar324 * fVar324 + fVar323 * fVar323 + fVar322 * fVar322;
    auVar377._20_4_ = fVar374 * fVar374 + fVar361 * fVar361 + fVar350 * fVar350;
    auVar377._24_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
    auVar377._28_4_ = fVar232 + fVar232 + fVar258;
    fVar232 = auVar16._0_4_;
    fVar258 = auVar16._4_4_;
    fVar287 = auVar16._8_4_;
    fVar309 = auVar16._12_4_;
    fVar325 = auVar16._16_4_;
    fVar262 = auVar16._20_4_;
    fVar264 = auVar16._24_4_;
    fVar194 = local_5e0._28_4_;
    fVar266 = auVar16._28_4_;
    local_620._0_4_ =
         local_580 * fVar216 * fVar232 +
         local_5a0 * fVar214 * fVar232 + fVar215 * fVar232 * local_5c0;
    local_620._4_4_ =
         fStack_57c * fVar235 * fVar258 +
         fStack_59c * fVar233 * fVar258 + fVar234 * fVar258 * fStack_5bc;
    fStack_618 = fStack_578 * fVar261 * fVar287 +
                 fStack_598 * fVar259 * fVar287 + fVar260 * fVar287 * fStack_5b8;
    fStack_614 = fStack_574 * fVar292 * fVar309 +
                 fStack_594 * fVar289 * fVar309 + fVar290 * fVar309 * fStack_5b4;
    fStack_610 = fStack_570 * fVar315 * fVar325 +
                 fStack_590 * fVar311 * fVar325 + fVar313 * fVar325 * fStack_5b0;
    fStack_60c = fStack_56c * fVar328 * fVar262 +
                 fStack_58c * fVar326 * fVar262 + fVar327 * fVar262 * fStack_5ac;
    fStack_608 = fStack_568 * fVar22 * fVar264 +
                 fStack_588 * fVar20 * fVar264 + fVar21 * fVar264 * fStack_5a8;
    fVar265 = fVar266 + fVar194 + 0.0;
    local_900._0_4_ =
         fVar220 * fVar216 * fVar232 + fVar214 * fVar232 * fVar219 + fVar215 * fVar232 * fVar218;
    local_900._4_4_ =
         fVar257 * fVar235 * fVar258 + fVar233 * fVar258 * fVar240 + fVar234 * fVar258 * fVar238;
    fStack_8f8 = fVar286 * fVar261 * fVar287 +
                 fVar259 * fVar287 * fVar284 + fVar260 * fVar287 * fVar283;
    fStack_8f4 = fVar307 * fVar292 * fVar309 +
                 fVar289 * fVar309 * fVar306 + fVar290 * fVar309 * fVar295;
    fStack_8f0 = fVar324 * fVar315 * fVar325 +
                 fVar311 * fVar325 * fVar323 + fVar313 * fVar325 * fVar322;
    fStack_8ec = fVar374 * fVar328 * fVar262 +
                 fVar326 * fVar262 * fVar361 + fVar327 * fVar262 * fVar350;
    fStack_8e8 = fVar26 * fVar22 * fVar264 + fVar20 * fVar264 * fVar25 + fVar21 * fVar264 * fVar24;
    fStack_8e4 = fVar194 + fVar265;
    auVar49._4_4_ = (float)local_900._4_4_ * (float)local_620._4_4_;
    auVar49._0_4_ = (float)local_900._0_4_ * (float)local_620._0_4_;
    auVar49._8_4_ = fStack_8f8 * fStack_618;
    auVar49._12_4_ = fStack_8f4 * fStack_614;
    auVar49._16_4_ = fStack_8f0 * fStack_610;
    auVar49._20_4_ = fStack_8ec * fStack_60c;
    auVar49._24_4_ = fStack_8e8 * fStack_608;
    auVar49._28_4_ = fVar265;
    auVar15 = vsubps_avx(auVar352,auVar49);
    auVar50._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
    auVar50._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
    auVar50._8_4_ = fStack_8f8 * fStack_8f8;
    auVar50._12_4_ = fStack_8f4 * fStack_8f4;
    auVar50._16_4_ = fStack_8f0 * fStack_8f0;
    auVar50._20_4_ = fStack_8ec * fStack_8ec;
    auVar50._24_4_ = fStack_8e8 * fStack_8e8;
    auVar50._28_4_ = fVar194;
    local_660 = vsubps_avx(auVar377,auVar50);
    local_920 = vsqrtps_avx(auVar111);
    fVar265 = (auVar165._0_4_ + local_920._0_4_) * 1.0000002;
    fVar127 = (auVar165._4_4_ + local_920._4_4_) * 1.0000002;
    fVar129 = (auVar165._8_4_ + local_920._8_4_) * 1.0000002;
    fVar131 = (auVar165._12_4_ + local_920._12_4_) * 1.0000002;
    fVar133 = (auVar165._16_4_ + local_920._16_4_) * 1.0000002;
    fVar135 = (auVar165._20_4_ + local_920._20_4_) * 1.0000002;
    fVar137 = (auVar165._24_4_ + local_920._24_4_) * 1.0000002;
    auVar51._4_4_ = fVar127 * fVar127;
    auVar51._0_4_ = fVar265 * fVar265;
    auVar51._8_4_ = fVar129 * fVar129;
    auVar51._12_4_ = fVar131 * fVar131;
    auVar51._16_4_ = fVar133 * fVar133;
    auVar51._20_4_ = fVar135 * fVar135;
    auVar51._24_4_ = fVar137 * fVar137;
    auVar51._28_4_ = auVar165._28_4_ + local_920._28_4_;
    fVar265 = auVar15._0_4_ + auVar15._0_4_;
    fVar127 = auVar15._4_4_ + auVar15._4_4_;
    local_300._0_8_ = CONCAT44(fVar127,fVar265);
    local_300._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_300._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_300._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_300._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_300._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    local_300._28_4_ = auVar15._28_4_ + auVar15._28_4_;
    auVar165 = vsubps_avx(local_660,auVar51);
    local_2e0._4_4_ = (float)local_620._4_4_ * (float)local_620._4_4_;
    local_2e0._0_4_ = (float)local_620._0_4_ * (float)local_620._0_4_;
    local_2e0._8_4_ = fStack_618 * fStack_618;
    local_2e0._12_4_ = fStack_614 * fStack_614;
    local_2e0._16_4_ = fStack_610 * fStack_610;
    local_2e0._20_4_ = fStack_60c * fStack_60c;
    local_2e0._24_4_ = fStack_608 * fStack_608;
    local_2e0._28_4_ = fStack_564;
    local_4a0 = vsubps_avx(local_2a0,local_2e0);
    local_6e0._4_4_ = fVar127 * fVar127;
    local_6e0._0_4_ = fVar265 * fVar265;
    fStack_6d8 = local_300._8_4_ * local_300._8_4_;
    fStack_6d4 = local_300._12_4_ * local_300._12_4_;
    fStack_6d0 = local_300._16_4_ * local_300._16_4_;
    fStack_6cc = local_300._20_4_ * local_300._20_4_;
    fStack_6c8 = local_300._24_4_ * local_300._24_4_;
    unique0x100124bc = fVar266;
    fVar129 = local_4a0._0_4_;
    local_700._0_4_ = fVar129 * 4.0;
    fVar131 = local_4a0._4_4_;
    local_700._4_4_ = fVar131 * 4.0;
    fVar133 = local_4a0._8_4_;
    fStack_6f8 = fVar133 * 4.0;
    fVar135 = local_4a0._12_4_;
    fStack_6f4 = fVar135 * 4.0;
    fVar137 = local_4a0._16_4_;
    fStack_6f0 = fVar137 * 4.0;
    fVar237 = local_4a0._20_4_;
    fStack_6ec = fVar237 * 4.0;
    fVar239 = local_4a0._24_4_;
    fStack_6e8 = fVar239 * 4.0;
    uStack_6e4 = 0x40800000;
    auVar52._4_4_ = auVar165._4_4_ * (float)local_700._4_4_;
    auVar52._0_4_ = auVar165._0_4_ * (float)local_700._0_4_;
    auVar52._8_4_ = auVar165._8_4_ * fStack_6f8;
    auVar52._12_4_ = auVar165._12_4_ * fStack_6f4;
    auVar52._16_4_ = auVar165._16_4_ * fStack_6f0;
    auVar52._20_4_ = auVar165._20_4_ * fStack_6ec;
    auVar52._24_4_ = auVar165._24_4_ * fStack_6e8;
    auVar52._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(_local_6e0,auVar52);
    auVar360 = ZEXT3264(auVar15);
    auVar111 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
    fStack_604 = fVar266 + fVar194 + 0.0;
    fVar194 = local_4a0._28_4_;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      auVar390._8_4_ = 0x7f800000;
      auVar390._0_8_ = 0x7f8000007f800000;
      auVar390._12_4_ = 0x7f800000;
      auVar390._16_4_ = 0x7f800000;
      auVar390._20_4_ = 0x7f800000;
      auVar390._24_4_ = 0x7f800000;
      auVar390._28_4_ = 0x7f800000;
      auVar365._8_4_ = 0xff800000;
      auVar365._0_8_ = 0xff800000ff800000;
      auVar365._12_4_ = 0xff800000;
      auVar365._16_4_ = 0xff800000;
      auVar365._20_4_ = 0xff800000;
      auVar365._24_4_ = 0xff800000;
      auVar365._28_4_ = 0xff800000;
      auVar275 = local_2a0;
      auVar13 = _local_6e0;
    }
    else {
      auVar14 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
      auVar16 = vsqrtps_avx(auVar15);
      auVar274._0_4_ = fVar129 + fVar129;
      auVar274._4_4_ = fVar131 + fVar131;
      auVar274._8_4_ = fVar133 + fVar133;
      auVar274._12_4_ = fVar135 + fVar135;
      auVar274._16_4_ = fVar137 + fVar137;
      auVar274._20_4_ = fVar237 + fVar237;
      auVar274._24_4_ = fVar239 + fVar239;
      auVar274._28_4_ = fVar194 + fVar194;
      auVar15 = vrcpps_avx(auVar274);
      fVar266 = auVar15._0_4_;
      fVar281 = auVar15._4_4_;
      auVar53._4_4_ = auVar274._4_4_ * fVar281;
      auVar53._0_4_ = auVar274._0_4_ * fVar266;
      fVar282 = auVar15._8_4_;
      auVar53._8_4_ = auVar274._8_4_ * fVar282;
      fVar285 = auVar15._12_4_;
      auVar53._12_4_ = auVar274._12_4_ * fVar285;
      fVar288 = auVar15._16_4_;
      auVar53._16_4_ = auVar274._16_4_ * fVar288;
      fVar291 = auVar15._20_4_;
      auVar53._20_4_ = auVar274._20_4_ * fVar291;
      fVar294 = auVar15._24_4_;
      auVar53._24_4_ = auVar274._24_4_ * fVar294;
      auVar53._28_4_ = auVar274._28_4_;
      auVar353._8_4_ = 0x3f800000;
      auVar353._0_8_ = 0x3f8000003f800000;
      auVar353._12_4_ = 0x3f800000;
      auVar353._16_4_ = 0x3f800000;
      auVar353._20_4_ = 0x3f800000;
      auVar353._24_4_ = 0x3f800000;
      auVar353._28_4_ = 0x3f800000;
      auVar157 = vsubps_avx(auVar353,auVar53);
      fVar266 = fVar266 + fVar266 * auVar157._0_4_;
      fVar281 = fVar281 + fVar281 * auVar157._4_4_;
      fVar282 = fVar282 + fVar282 * auVar157._8_4_;
      fVar285 = fVar285 + fVar285 * auVar157._12_4_;
      fVar288 = fVar288 + fVar288 * auVar157._16_4_;
      fVar291 = fVar291 + fVar291 * auVar157._20_4_;
      fVar294 = fVar294 + fVar294 * auVar157._24_4_;
      auVar302._0_8_ = CONCAT44(fVar127,fVar265) ^ 0x8000000080000000;
      auVar302._8_4_ = -local_300._8_4_;
      auVar302._12_4_ = -local_300._12_4_;
      auVar302._16_4_ = -local_300._16_4_;
      auVar302._20_4_ = -local_300._20_4_;
      auVar302._24_4_ = -local_300._24_4_;
      auVar302._28_4_ = -local_300._28_4_;
      auVar181 = vsubps_avx(auVar302,auVar16);
      fVar265 = auVar181._0_4_ * fVar266;
      fVar127 = auVar181._4_4_ * fVar281;
      auVar13._4_4_ = fVar127;
      auVar13._0_4_ = fVar265;
      fVar308 = auVar181._8_4_ * fVar282;
      auVar13._8_4_ = fVar308;
      fVar310 = auVar181._12_4_ * fVar285;
      auVar13._12_4_ = fVar310;
      fVar312 = auVar181._16_4_ * fVar288;
      auVar13._16_4_ = fVar312;
      fVar314 = auVar181._20_4_ * fVar291;
      auVar13._20_4_ = fVar314;
      fVar316 = auVar181._24_4_ * fVar294;
      auVar13._24_4_ = fVar316;
      auVar13._28_4_ = auVar181._28_4_;
      auVar16 = vsubps_avx(auVar16,local_300);
      fVar266 = auVar16._0_4_ * fVar266;
      fVar281 = auVar16._4_4_ * fVar281;
      auVar54._4_4_ = fVar281;
      auVar54._0_4_ = fVar266;
      fVar282 = auVar16._8_4_ * fVar282;
      auVar54._8_4_ = fVar282;
      fVar285 = auVar16._12_4_ * fVar285;
      auVar54._12_4_ = fVar285;
      fVar288 = auVar16._16_4_ * fVar288;
      auVar54._16_4_ = fVar288;
      fVar291 = auVar16._20_4_ * fVar291;
      auVar54._20_4_ = fVar291;
      fVar294 = auVar16._24_4_ * fVar294;
      auVar54._24_4_ = fVar294;
      auVar54._28_4_ = auVar16._28_4_;
      local_680 = fVar232 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar265);
      fStack_67c = fVar258 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar127);
      fStack_678 = fVar287 * (fStack_8f8 + fStack_618 * fVar308);
      fStack_674 = fVar309 * (fStack_8f4 + fStack_614 * fVar310);
      fStack_670 = fVar325 * (fStack_8f0 + fStack_610 * fVar312);
      fStack_66c = fVar262 * (fStack_8ec + fStack_60c * fVar314);
      fStack_668 = fVar264 * (fStack_8e8 + fStack_608 * fVar316);
      fStack_664 = fStack_8e4 + auVar15._28_4_ + auVar157._28_4_;
      auVar354._8_4_ = 0x7fffffff;
      auVar354._0_8_ = 0x7fffffff7fffffff;
      auVar354._12_4_ = 0x7fffffff;
      auVar354._16_4_ = 0x7fffffff;
      auVar354._20_4_ = 0x7fffffff;
      auVar354._24_4_ = 0x7fffffff;
      auVar354._28_4_ = 0x7fffffff;
      auVar15 = vandps_avx(local_2e0,auVar354);
      auVar16 = vmaxps_avx(local_480,auVar15);
      auVar55._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar55._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar55._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar55._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar55._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar55._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar55._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar55._28_4_ = auVar16._28_4_;
      auVar15 = vandps_avx(auVar354,local_4a0);
      auVar15 = vcmpps_avx(auVar15,auVar55,1);
      auVar360 = ZEXT3264(auVar15);
      auVar366._8_4_ = 0x7f800000;
      auVar366._0_8_ = 0x7f8000007f800000;
      auVar366._12_4_ = 0x7f800000;
      auVar366._16_4_ = 0x7f800000;
      auVar366._20_4_ = 0x7f800000;
      auVar366._24_4_ = 0x7f800000;
      auVar366._28_4_ = 0x7f800000;
      auVar390 = vblendvps_avx(auVar366,auVar13,auVar14);
      local_6a0._4_4_ = fVar258 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar281);
      local_6a0._0_4_ = fVar232 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar266);
      fStack_698 = fVar287 * (fStack_8f8 + fStack_618 * fVar282);
      fStack_694 = fVar309 * (fStack_8f4 + fStack_614 * fVar285);
      fStack_690 = fVar325 * (fStack_8f0 + fStack_610 * fVar288);
      fStack_68c = fVar262 * (fStack_8ec + fStack_60c * fVar291);
      fStack_688 = fVar264 * (fStack_8e8 + fStack_608 * fVar294);
      fStack_684 = fStack_8e4 + auVar16._28_4_;
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar365 = vblendvps_avx(auVar275,auVar54,auVar14);
      auVar16 = auVar14 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar111 = vandps_avx(auVar15,auVar14);
        auVar102 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar275 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
        auVar400._8_4_ = 0xff800000;
        auVar400._0_8_ = 0xff800000ff800000;
        auVar400._12_4_ = 0xff800000;
        auVar400._16_4_ = 0xff800000;
        auVar400._20_4_ = 0xff800000;
        auVar400._24_4_ = 0xff800000;
        auVar400._28_4_ = 0xff800000;
        auVar380._8_4_ = 0x7f800000;
        auVar380._0_8_ = 0x7f8000007f800000;
        auVar380._12_4_ = 0x7f800000;
        auVar380._16_4_ = 0x7f800000;
        auVar380._20_4_ = 0x7f800000;
        auVar380._24_4_ = 0x7f800000;
        auVar380._28_4_ = 0x7f800000;
        auVar165 = vblendvps_avx(auVar380,auVar400,auVar275);
        auVar27 = vpmovsxwd_avx(auVar102);
        auVar360 = ZEXT1664(auVar27);
        auVar102 = vpunpckhwd_avx(auVar102,auVar102);
        auVar255._16_16_ = auVar102;
        auVar255._0_16_ = auVar27;
        auVar390 = vblendvps_avx(auVar390,auVar165,auVar255);
        auVar13 = vblendvps_avx(auVar400,auVar380,auVar275);
        auVar365 = vblendvps_avx(auVar365,auVar13,auVar255);
        auVar165 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar124._0_4_ = auVar111._0_4_ ^ auVar165._0_4_;
        auVar124._4_4_ = auVar111._4_4_ ^ auVar165._4_4_;
        auVar124._8_4_ = auVar111._8_4_ ^ auVar165._8_4_;
        auVar124._12_4_ = auVar111._12_4_ ^ auVar165._12_4_;
        auVar124._16_4_ = auVar111._16_4_ ^ auVar165._16_4_;
        auVar124._20_4_ = auVar111._20_4_ ^ auVar165._20_4_;
        auVar124._24_4_ = auVar111._24_4_ ^ auVar165._24_4_;
        auVar124._28_4_ = auVar111._28_4_ ^ auVar165._28_4_;
        auVar111 = vorps_avx(auVar275,auVar124);
        auVar111 = vandps_avx(auVar14,auVar111);
      }
    }
    auVar367 = ZEXT3264(auVar365);
    auVar305 = ZEXT3264(auVar13);
    auVar280 = ZEXT3264(auVar275);
    auVar336 = ZEXT3264(auVar14);
    auVar256 = ZEXT3264(local_460);
    auVar165 = local_460 & auVar111;
    auVar381 = ZEXT3264(CONCAT428(fStack_564,
                                  CONCAT424(fStack_568,
                                            CONCAT420(fStack_56c,
                                                      CONCAT416(fStack_570,
                                                                CONCAT412(fStack_574,
                                                                          CONCAT48(fStack_578,
                                                                                   CONCAT44(
                                                  fStack_57c,local_580))))))));
    if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar165 >> 0x7f,0) != '\0') ||
          (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar165 >> 0xbf,0) != '\0') ||
        (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar165[0x1f] < '\0') {
      auVar102 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_));
      auVar102 = vshufps_avx(auVar102,auVar102,0);
      auVar249._16_16_ = auVar102;
      auVar249._0_16_ = auVar102;
      auVar16 = vmaxps_avx(auVar249,auVar390);
      auVar102 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7f0._0_4_));
      auVar102 = vshufps_avx(auVar102,auVar102,0);
      auVar250._16_16_ = auVar102;
      auVar250._0_16_ = auVar102;
      auVar157 = vminps_avx(auVar250,auVar365);
      fVar291 = local_660._28_4_;
      auVar367 = ZEXT3264(CONCAT428(fStack_584,
                                    CONCAT424(fStack_588,
                                              CONCAT420(fStack_58c,
                                                        CONCAT416(fStack_590,
                                                                  CONCAT412(fStack_594,
                                                                            CONCAT48(fStack_598,
                                                                                     CONCAT44(
                                                  fStack_59c,local_5a0))))))));
      auVar180._0_4_ = local_580 * fVar375 + local_5a0 * fVar362 + fVar329 * local_5c0;
      auVar180._4_4_ = fStack_57c * fVar382 + fStack_59c * fVar368 + fVar337 * fStack_5bc;
      auVar180._8_4_ = fStack_578 * fVar383 + fStack_598 * fVar369 + fVar339 * fStack_5b8;
      auVar180._12_4_ = fStack_574 * fVar384 + fStack_594 * fVar370 + fVar341 * fStack_5b4;
      auVar180._16_4_ = fStack_570 * fVar385 + fStack_590 * fVar371 + fVar343 * fStack_5b0;
      auVar180._20_4_ = fStack_56c * fVar386 + fStack_58c * fVar372 + fVar345 * fStack_5ac;
      auVar180._24_4_ = fStack_568 * fVar387 + fStack_588 * fVar373 + fVar347 * fStack_5a8;
      auVar180._28_4_ = fVar291 + fVar291 + auVar17._28_4_;
      auVar165 = vrcpps_avx(auVar180);
      fVar266 = auVar165._0_4_;
      fVar265 = auVar165._4_4_;
      auVar56._4_4_ = auVar180._4_4_ * fVar265;
      auVar56._0_4_ = auVar180._0_4_ * fVar266;
      fVar127 = auVar165._8_4_;
      auVar56._8_4_ = auVar180._8_4_ * fVar127;
      fVar281 = auVar165._12_4_;
      auVar56._12_4_ = auVar180._12_4_ * fVar281;
      fVar282 = auVar165._16_4_;
      auVar56._16_4_ = auVar180._16_4_ * fVar282;
      fVar285 = auVar165._20_4_;
      auVar56._20_4_ = auVar180._20_4_ * fVar285;
      fVar288 = auVar165._24_4_;
      auVar56._24_4_ = auVar180._24_4_ * fVar288;
      auVar56._28_4_ = uStack_1c4;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = 0x3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar355._16_4_ = 0x3f800000;
      auVar355._20_4_ = 0x3f800000;
      auVar355._24_4_ = 0x3f800000;
      auVar355._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar355,auVar56);
      auVar303._8_4_ = 0x7fffffff;
      auVar303._0_8_ = 0x7fffffff7fffffff;
      auVar303._12_4_ = 0x7fffffff;
      auVar303._16_4_ = 0x7fffffff;
      auVar303._20_4_ = 0x7fffffff;
      auVar303._24_4_ = 0x7fffffff;
      auVar303._28_4_ = 0x7fffffff;
      auVar165 = vandps_avx(auVar180,auVar303);
      auVar335._8_4_ = 0x219392ef;
      auVar335._0_8_ = 0x219392ef219392ef;
      auVar335._12_4_ = 0x219392ef;
      auVar335._16_4_ = 0x219392ef;
      auVar335._20_4_ = 0x219392ef;
      auVar335._24_4_ = 0x219392ef;
      auVar335._28_4_ = 0x219392ef;
      auVar165 = vcmpps_avx(auVar165,auVar335,1);
      auVar57._4_4_ =
           (fVar265 + fVar265 * auVar15._4_4_) *
           -(fVar382 * fVar257 + fVar368 * fVar240 + fVar337 * fVar238);
      auVar57._0_4_ =
           (fVar266 + fVar266 * auVar15._0_4_) *
           -(fVar375 * fVar220 + fVar362 * fVar219 + fVar329 * fVar218);
      auVar57._8_4_ =
           (fVar127 + fVar127 * auVar15._8_4_) *
           -(fVar383 * fVar286 + fVar369 * fVar284 + fVar339 * fVar283);
      auVar57._12_4_ =
           (fVar281 + fVar281 * auVar15._12_4_) *
           -(fVar384 * fVar307 + fVar370 * fVar306 + fVar341 * fVar295);
      auVar57._16_4_ =
           (fVar282 + fVar282 * auVar15._16_4_) *
           -(fVar385 * fVar324 + fVar371 * fVar323 + fVar343 * fVar322);
      auVar57._20_4_ =
           (fVar285 + fVar285 * auVar15._20_4_) *
           -(fVar386 * fVar374 + fVar372 * fVar361 + fVar345 * fVar350);
      auVar57._24_4_ =
           (fVar288 + fVar288 * auVar15._24_4_) *
           -(fVar387 * fVar26 + fVar373 * fVar25 + fVar347 * fVar24);
      auVar57._28_4_ = -(auVar17._28_4_ + local_300._28_4_ + fVar291);
      auVar336 = ZEXT3264(auVar111);
      auVar102 = ZEXT816(0) << 0x40;
      auVar15 = vcmpps_avx(auVar180,ZEXT1632(auVar102),1);
      auVar17 = vorps_avx(auVar165,auVar15);
      auVar15 = vcmpps_avx(auVar180,ZEXT1632(auVar102),6);
      auVar15 = vorps_avx(auVar165,auVar15);
      auVar391._8_4_ = 0xff800000;
      auVar391._0_8_ = 0xff800000ff800000;
      auVar391._12_4_ = 0xff800000;
      auVar391._16_4_ = 0xff800000;
      auVar391._20_4_ = 0xff800000;
      auVar391._24_4_ = 0xff800000;
      auVar391._28_4_ = 0xff800000;
      auVar165 = vblendvps_avx(auVar57,auVar391,auVar17);
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar360 = ZEXT3264(auVar356);
      auVar15 = vblendvps_avx(auVar57,auVar356,auVar15);
      auVar16 = vmaxps_avx(auVar16,auVar165);
      auVar17 = vminps_avx(auVar157,auVar15);
      auVar117 = ZEXT1632(auVar102);
      auVar165 = vsubps_avx(auVar117,local_880);
      auVar15 = vsubps_avx(auVar117,local_a40);
      auVar58._4_4_ = auVar15._4_4_ * -fVar236;
      auVar58._0_4_ = auVar15._0_4_ * -fVar217;
      auVar58._8_4_ = auVar15._8_4_ * -fVar263;
      auVar58._12_4_ = auVar15._12_4_ * -fVar293;
      auVar58._16_4_ = auVar15._16_4_ * -fVar317;
      auVar58._20_4_ = auVar15._20_4_ * -fVar349;
      auVar58._24_4_ = auVar15._24_4_ * -fVar23;
      auVar58._28_4_ = auVar15._28_4_;
      auVar59._4_4_ = fVar393 * auVar165._4_4_;
      auVar59._0_4_ = fVar388 * auVar165._0_4_;
      auVar59._8_4_ = fVar394 * auVar165._8_4_;
      auVar59._12_4_ = fVar395 * auVar165._12_4_;
      auVar59._16_4_ = fVar396 * auVar165._16_4_;
      auVar59._20_4_ = fVar397 * auVar165._20_4_;
      auVar59._24_4_ = fVar398 * auVar165._24_4_;
      auVar59._28_4_ = auVar165._28_4_;
      auVar165 = vsubps_avx(auVar58,auVar59);
      auVar15 = vsubps_avx(auVar117,local_9c0);
      auVar61._4_4_ = fVar338 * auVar15._4_4_;
      auVar61._0_4_ = fVar330 * auVar15._0_4_;
      auVar61._8_4_ = fVar340 * auVar15._8_4_;
      auVar61._12_4_ = fVar342 * auVar15._12_4_;
      auVar61._16_4_ = fVar344 * auVar15._16_4_;
      auVar61._20_4_ = fVar346 * auVar15._20_4_;
      uVar60 = auVar15._28_4_;
      auVar61._24_4_ = fVar348 * auVar15._24_4_;
      auVar61._28_4_ = uVar60;
      auVar157 = vsubps_avx(auVar165,auVar61);
      auVar62._4_4_ = fStack_5bc * -fVar236;
      auVar62._0_4_ = local_5c0 * -fVar217;
      auVar62._8_4_ = fStack_5b8 * -fVar263;
      auVar62._12_4_ = fStack_5b4 * -fVar293;
      auVar62._16_4_ = fStack_5b0 * -fVar317;
      auVar62._20_4_ = fStack_5ac * -fVar349;
      auVar62._24_4_ = fStack_5a8 * -fVar23;
      auVar62._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar63._4_4_ = fStack_59c * fVar393;
      auVar63._0_4_ = local_5a0 * fVar388;
      auVar63._8_4_ = fStack_598 * fVar394;
      auVar63._12_4_ = fStack_594 * fVar395;
      auVar63._16_4_ = fStack_590 * fVar396;
      auVar63._20_4_ = fStack_58c * fVar397;
      auVar63._24_4_ = fStack_588 * fVar398;
      auVar63._28_4_ = uVar60;
      auVar165 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fStack_57c * fVar338;
      auVar64._0_4_ = local_580 * fVar330;
      auVar64._8_4_ = fStack_578 * fVar340;
      auVar64._12_4_ = fStack_574 * fVar342;
      auVar64._16_4_ = fStack_570 * fVar344;
      auVar64._20_4_ = fStack_56c * fVar346;
      auVar64._24_4_ = fStack_568 * fVar348;
      auVar64._28_4_ = uVar60;
      auVar378._8_4_ = 0x3f800000;
      auVar378._0_8_ = 0x3f8000003f800000;
      auVar378._12_4_ = 0x3f800000;
      auVar378._16_4_ = 0x3f800000;
      auVar378._20_4_ = 0x3f800000;
      auVar378._24_4_ = 0x3f800000;
      auVar378._28_4_ = 0x3f800000;
      auVar381 = ZEXT3264(auVar378);
      auVar181 = vsubps_avx(auVar165,auVar64);
      auVar165 = vrcpps_avx(auVar181);
      fVar217 = auVar165._0_4_;
      fVar218 = auVar165._4_4_;
      auVar65._4_4_ = auVar181._4_4_ * fVar218;
      auVar65._0_4_ = auVar181._0_4_ * fVar217;
      fVar219 = auVar165._8_4_;
      auVar65._8_4_ = auVar181._8_4_ * fVar219;
      fVar220 = auVar165._12_4_;
      auVar65._12_4_ = auVar181._12_4_ * fVar220;
      fVar236 = auVar165._16_4_;
      auVar65._16_4_ = auVar181._16_4_ * fVar236;
      fVar238 = auVar165._20_4_;
      auVar65._20_4_ = auVar181._20_4_ * fVar238;
      fVar240 = auVar165._24_4_;
      auVar65._24_4_ = auVar181._24_4_ * fVar240;
      auVar65._28_4_ = fStack_5a4;
      auVar18 = vsubps_avx(auVar378,auVar65);
      auVar165 = vandps_avx(auVar181,auVar303);
      auVar304._8_4_ = 0x219392ef;
      auVar304._0_8_ = 0x219392ef219392ef;
      auVar304._12_4_ = 0x219392ef;
      auVar304._16_4_ = 0x219392ef;
      auVar304._20_4_ = 0x219392ef;
      auVar304._24_4_ = 0x219392ef;
      auVar304._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar165,auVar304,1);
      auVar280 = ZEXT3264(auVar15);
      auVar66._4_4_ = (fVar218 + fVar218 * auVar18._4_4_) * -auVar157._4_4_;
      auVar66._0_4_ = (fVar217 + fVar217 * auVar18._0_4_) * -auVar157._0_4_;
      auVar66._8_4_ = (fVar219 + fVar219 * auVar18._8_4_) * -auVar157._8_4_;
      auVar66._12_4_ = (fVar220 + fVar220 * auVar18._12_4_) * -auVar157._12_4_;
      auVar66._16_4_ = (fVar236 + fVar236 * auVar18._16_4_) * -auVar157._16_4_;
      auVar66._20_4_ = (fVar238 + fVar238 * auVar18._20_4_) * -auVar157._20_4_;
      auVar66._24_4_ = (fVar240 + fVar240 * auVar18._24_4_) * -auVar157._24_4_;
      auVar66._28_4_ = auVar157._28_4_ ^ 0x80000000;
      auVar165 = vcmpps_avx(auVar181,auVar117,1);
      auVar165 = vorps_avx(auVar15,auVar165);
      auVar165 = vblendvps_avx(auVar66,auVar391,auVar165);
      local_640 = vmaxps_avx(auVar16,auVar165);
      auVar305 = ZEXT3264(local_640);
      auVar256 = ZEXT864(0) << 0x20;
      auVar165 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,6);
      auVar165 = vorps_avx(auVar15,auVar165);
      auVar165 = vblendvps_avx(auVar66,auVar356,auVar165);
      auVar111 = vandps_avx(auVar111,local_460);
      local_500 = vminps_avx(auVar17,auVar165);
      auVar165 = vcmpps_avx(local_640,local_500,2);
      auVar15 = auVar111 & auVar165;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar15 = vminps_avx(_local_ae0,_local_6c0);
        auVar16 = vminps_avx(local_7c0,_local_7e0);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar15 = vsubps_avx(auVar15,local_920);
        auVar111 = vandps_avx(auVar165,auVar111);
        auVar87._4_4_ = fStack_67c;
        auVar87._0_4_ = local_680;
        auVar87._8_4_ = fStack_678;
        auVar87._12_4_ = fStack_674;
        auVar87._16_4_ = fStack_670;
        auVar87._20_4_ = fStack_66c;
        auVar87._24_4_ = fStack_668;
        auVar87._28_4_ = fStack_664;
        auVar165 = vminps_avx(auVar87,auVar378);
        auVar165 = vmaxps_avx(auVar165,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar170 + fVar139 * (auVar165._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar191 + fVar166 * (auVar165._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar192 + fVar167 * (auVar165._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar193 + fVar169 * (auVar165._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar170 + fVar139 * (auVar165._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar191 + fVar166 * (auVar165._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar192 + fVar167 * (auVar165._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar193 + auVar165._28_4_ + 7.0;
        auVar165 = vminps_avx(_local_6a0,auVar378);
        auVar165 = vmaxps_avx(auVar165,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar170 + fVar139 * (auVar165._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar191 + fVar166 * (auVar165._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar192 + fVar167 * (auVar165._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar193 + fVar169 * (auVar165._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar170 + fVar139 * (auVar165._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar191 + fVar166 * (auVar165._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar192 + fVar167 * (auVar165._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar193 + auVar165._28_4_ + 7.0;
        auVar67._4_4_ = auVar15._4_4_ * 0.99999976;
        auVar67._0_4_ = auVar15._0_4_ * 0.99999976;
        auVar67._8_4_ = auVar15._8_4_ * 0.99999976;
        auVar67._12_4_ = auVar15._12_4_ * 0.99999976;
        auVar67._16_4_ = auVar15._16_4_ * 0.99999976;
        auVar67._20_4_ = auVar15._20_4_ * 0.99999976;
        auVar67._24_4_ = auVar15._24_4_ * 0.99999976;
        auVar67._28_4_ = 0x3f7ffffc;
        auVar165 = vmaxps_avx(ZEXT832(0) << 0x20,auVar67);
        auVar68._4_4_ = auVar165._4_4_ * auVar165._4_4_;
        auVar68._0_4_ = auVar165._0_4_ * auVar165._0_4_;
        auVar68._8_4_ = auVar165._8_4_ * auVar165._8_4_;
        auVar68._12_4_ = auVar165._12_4_ * auVar165._12_4_;
        auVar68._16_4_ = auVar165._16_4_ * auVar165._16_4_;
        auVar68._20_4_ = auVar165._20_4_ * auVar165._20_4_;
        auVar68._24_4_ = auVar165._24_4_ * auVar165._24_4_;
        auVar68._28_4_ = auVar165._28_4_;
        auVar15 = vsubps_avx(local_660,auVar68);
        auVar69._4_4_ = auVar15._4_4_ * (float)local_700._4_4_;
        auVar69._0_4_ = auVar15._0_4_ * (float)local_700._0_4_;
        auVar69._8_4_ = auVar15._8_4_ * fStack_6f8;
        auVar69._12_4_ = auVar15._12_4_ * fStack_6f4;
        auVar69._16_4_ = auVar15._16_4_ * fStack_6f0;
        auVar69._20_4_ = auVar15._20_4_ * fStack_6ec;
        auVar69._24_4_ = auVar15._24_4_ * fStack_6e8;
        auVar69._28_4_ = auVar165._28_4_;
        auVar16 = vsubps_avx(_local_6e0,auVar69);
        auVar165 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,5);
        if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar165 >> 0x7f,0) == '\0') &&
              (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar165 >> 0xbf,0) == '\0') &&
            (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar165[0x1f]) {
          auVar157 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6c0 = ZEXT832(0) << 0x20;
          _local_6e0 = ZEXT832(0) << 0x20;
          _local_700 = ZEXT832(0) << 0x20;
          auVar181 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar206 = ZEXT828(0) << 0x20;
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar276._8_4_ = 0xff800000;
          auVar276._0_8_ = 0xff800000ff800000;
          auVar276._12_4_ = 0xff800000;
          auVar276._16_4_ = 0xff800000;
          auVar276._20_4_ = 0xff800000;
          auVar276._24_4_ = 0xff800000;
          auVar276._28_4_ = 0xff800000;
        }
        else {
          local_980 = auVar15;
          local_a40 = auVar165;
          auVar157 = vsqrtps_avx(auVar16);
          auVar182._0_4_ = fVar129 + fVar129;
          auVar182._4_4_ = fVar131 + fVar131;
          auVar182._8_4_ = fVar133 + fVar133;
          auVar182._12_4_ = fVar135 + fVar135;
          auVar182._16_4_ = fVar137 + fVar137;
          auVar182._20_4_ = fVar237 + fVar237;
          auVar182._24_4_ = fVar239 + fVar239;
          auVar182._28_4_ = fVar194 + fVar194;
          auVar17 = vrcpps_avx(auVar182);
          fVar194 = auVar17._0_4_;
          fVar217 = auVar17._4_4_;
          auVar70._4_4_ = auVar182._4_4_ * fVar217;
          auVar70._0_4_ = auVar182._0_4_ * fVar194;
          fVar218 = auVar17._8_4_;
          auVar70._8_4_ = auVar182._8_4_ * fVar218;
          fVar219 = auVar17._12_4_;
          auVar70._12_4_ = auVar182._12_4_ * fVar219;
          fVar220 = auVar17._16_4_;
          auVar70._16_4_ = auVar182._16_4_ * fVar220;
          fVar236 = auVar17._20_4_;
          auVar70._20_4_ = auVar182._20_4_ * fVar236;
          fVar238 = auVar17._24_4_;
          auVar70._24_4_ = auVar182._24_4_ * fVar238;
          auVar70._28_4_ = auVar182._28_4_;
          auVar181 = vsubps_avx(auVar378,auVar70);
          fVar194 = fVar194 + fVar194 * auVar181._0_4_;
          fVar217 = fVar217 + fVar217 * auVar181._4_4_;
          fVar218 = fVar218 + fVar218 * auVar181._8_4_;
          fVar219 = fVar219 + fVar219 * auVar181._12_4_;
          fVar220 = fVar220 + fVar220 * auVar181._16_4_;
          fVar236 = fVar236 + fVar236 * auVar181._20_4_;
          fVar238 = fVar238 + fVar238 * auVar181._24_4_;
          fVar240 = auVar17._28_4_ + auVar181._28_4_;
          auVar211._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar211._8_4_ = -local_300._8_4_;
          auVar211._12_4_ = -local_300._12_4_;
          auVar211._16_4_ = -local_300._16_4_;
          auVar211._20_4_ = -local_300._20_4_;
          auVar211._24_4_ = -local_300._24_4_;
          auVar211._28_4_ = -local_300._28_4_;
          auVar17 = vsubps_avx(auVar211,auVar157);
          fVar306 = auVar17._0_4_ * fVar194;
          fVar307 = auVar17._4_4_ * fVar217;
          auVar71._4_4_ = fVar307;
          auVar71._0_4_ = fVar306;
          fVar317 = auVar17._8_4_ * fVar218;
          auVar71._8_4_ = fVar317;
          fVar322 = auVar17._12_4_ * fVar219;
          auVar71._12_4_ = fVar322;
          fVar323 = auVar17._16_4_ * fVar220;
          auVar71._16_4_ = fVar323;
          fVar324 = auVar17._20_4_ * fVar236;
          auVar71._20_4_ = fVar324;
          fVar349 = auVar17._24_4_ * fVar238;
          auVar71._24_4_ = fVar349;
          auVar71._28_4_ = 0xff800000;
          auVar157 = vsubps_avx(auVar157,local_300);
          fVar194 = auVar157._0_4_ * fVar194;
          fVar217 = auVar157._4_4_ * fVar217;
          auVar72._4_4_ = fVar217;
          auVar72._0_4_ = fVar194;
          fVar218 = auVar157._8_4_ * fVar218;
          auVar72._8_4_ = fVar218;
          fVar219 = auVar157._12_4_ * fVar219;
          auVar72._12_4_ = fVar219;
          fVar220 = auVar157._16_4_ * fVar220;
          auVar72._16_4_ = fVar220;
          fVar236 = auVar157._20_4_ * fVar236;
          auVar72._20_4_ = fVar236;
          fVar238 = auVar157._24_4_ * fVar238;
          auVar72._24_4_ = fVar238;
          auVar72._28_4_ = 0x3f800000;
          fVar257 = fVar232 * ((float)local_620._0_4_ * fVar306 + (float)local_900._0_4_);
          fVar263 = fVar258 * ((float)local_620._4_4_ * fVar307 + (float)local_900._4_4_);
          fVar283 = fVar287 * (fStack_618 * fVar317 + fStack_8f8);
          fVar284 = fVar309 * (fStack_614 * fVar322 + fStack_8f4);
          fVar286 = fVar325 * (fStack_610 * fVar323 + fStack_8f0);
          fVar293 = fVar262 * (fStack_60c * fVar324 + fStack_8ec);
          fVar295 = fVar264 * (fStack_608 * fVar349 + fStack_8e8);
          auVar158._0_4_ = local_860 + fVar216 * fVar257;
          auVar158._4_4_ = fStack_85c + fVar235 * fVar263;
          auVar158._8_4_ = fStack_858 + fVar261 * fVar283;
          auVar158._12_4_ = fStack_854 + fVar292 * fVar284;
          auVar158._16_4_ = fStack_850 + fVar315 * fVar286;
          auVar158._20_4_ = fStack_84c + fVar328 * fVar293;
          auVar158._24_4_ = fStack_848 + fVar22 * fVar295;
          auVar158._28_4_ = fStack_844 + auVar157._28_4_ + fStack_8e4;
          auVar73._4_4_ = fStack_57c * fVar307;
          auVar73._0_4_ = local_580 * fVar306;
          auVar73._8_4_ = fStack_578 * fVar317;
          auVar73._12_4_ = fStack_574 * fVar322;
          auVar73._16_4_ = fStack_570 * fVar323;
          auVar73._20_4_ = fStack_56c * fVar324;
          auVar73._24_4_ = fStack_568 * fVar349;
          auVar73._28_4_ = fVar240;
          auVar157 = vsubps_avx(auVar73,auVar158);
          _local_a60 = auVar157;
          auVar183._0_4_ = fVar99 + fVar214 * fVar257;
          auVar183._4_4_ = fVar126 + fVar233 * fVar263;
          auVar183._8_4_ = fVar128 + fVar259 * fVar283;
          auVar183._12_4_ = fVar130 + fVar289 * fVar284;
          auVar183._16_4_ = fVar132 + fVar311 * fVar286;
          auVar183._20_4_ = fVar134 + fVar326 * fVar293;
          auVar183._24_4_ = fVar136 + fVar20 * fVar295;
          auVar183._28_4_ = fVar138 + fVar240;
          auVar252._0_4_ = local_5a0 * fVar306;
          auVar252._4_4_ = fStack_59c * fVar307;
          auVar252._8_4_ = fStack_598 * fVar317;
          auVar252._12_4_ = fStack_594 * fVar322;
          auVar252._16_4_ = fStack_590 * fVar323;
          auVar252._20_4_ = fStack_58c * fVar324;
          auVar252._24_4_ = fStack_588 * fVar349;
          auVar252._28_4_ = 0;
          auVar181 = vsubps_avx(auVar252,auVar183);
          local_880 = auVar181;
          auVar212._0_4_ = local_840 + fVar215 * fVar257;
          auVar212._4_4_ = fStack_83c + fVar234 * fVar263;
          auVar212._8_4_ = fStack_838 + fVar260 * fVar283;
          auVar212._12_4_ = aStack_834.w + fVar290 * fVar284;
          auVar212._16_4_ = fStack_830 + fVar313 * fVar286;
          auVar212._20_4_ = fStack_82c + fVar327 * fVar293;
          auVar212._24_4_ = fStack_828 + fVar21 * fVar295;
          auVar212._28_4_ = fStack_824 + auVar17._28_4_;
          auVar74._4_4_ = fStack_5bc * fVar307;
          auVar74._0_4_ = local_5c0 * fVar306;
          auVar74._8_4_ = fStack_5b8 * fVar317;
          auVar74._12_4_ = fStack_5b4 * fVar322;
          auVar74._16_4_ = fStack_5b0 * fVar323;
          auVar74._20_4_ = fStack_5ac * fVar324;
          auVar74._24_4_ = fStack_5a8 * fVar349;
          auVar74._28_4_ = 0;
          auVar17 = vsubps_avx(auVar74,auVar212);
          auVar206 = auVar17._0_28_;
          fVar232 = fVar232 * ((float)local_620._0_4_ * fVar194 + (float)local_900._0_4_);
          fVar258 = fVar258 * ((float)local_620._4_4_ * fVar217 + (float)local_900._4_4_);
          fVar287 = fVar287 * (fStack_618 * fVar218 + fStack_8f8);
          fVar309 = fVar309 * (fStack_614 * fVar219 + fStack_8f4);
          fVar325 = fVar325 * (fStack_610 * fVar220 + fStack_8f0);
          fVar262 = fVar262 * (fStack_60c * fVar236 + fStack_8ec);
          fVar264 = fVar264 * (fStack_608 * fVar238 + fStack_8e8);
          auVar277._0_4_ = local_860 + fVar216 * fVar232;
          auVar277._4_4_ = fStack_85c + fVar235 * fVar258;
          auVar277._8_4_ = fStack_858 + fVar261 * fVar287;
          auVar277._12_4_ = fStack_854 + fVar292 * fVar309;
          auVar277._16_4_ = fStack_850 + fVar315 * fVar325;
          auVar277._20_4_ = fStack_84c + fVar328 * fVar262;
          auVar277._24_4_ = fStack_848 + fVar22 * fVar264;
          auVar277._28_4_ = fStack_844 + fStack_704;
          auVar75._4_4_ = fStack_57c * fVar217;
          auVar75._0_4_ = local_580 * fVar194;
          auVar75._8_4_ = fStack_578 * fVar218;
          auVar75._12_4_ = fStack_574 * fVar219;
          auVar75._16_4_ = fStack_570 * fVar220;
          auVar75._20_4_ = fStack_56c * fVar236;
          auVar75._24_4_ = fStack_568 * fVar238;
          auVar75._28_4_ = fStack_844;
          _local_6c0 = vsubps_avx(auVar75,auVar277);
          auVar278._0_4_ = fVar99 + fVar214 * fVar232;
          auVar278._4_4_ = fVar126 + fVar233 * fVar258;
          auVar278._8_4_ = fVar128 + fVar259 * fVar287;
          auVar278._12_4_ = fVar130 + fVar289 * fVar309;
          auVar278._16_4_ = fVar132 + fVar311 * fVar325;
          auVar278._20_4_ = fVar134 + fVar326 * fVar262;
          auVar278._24_4_ = fVar136 + fVar20 * fVar264;
          auVar278._28_4_ = fVar138 + local_6c0._28_4_;
          auVar76._4_4_ = fVar217 * fStack_59c;
          auVar76._0_4_ = fVar194 * local_5a0;
          auVar76._8_4_ = fVar218 * fStack_598;
          auVar76._12_4_ = fVar219 * fStack_594;
          auVar76._16_4_ = fVar220 * fStack_590;
          auVar76._20_4_ = fVar236 * fStack_58c;
          auVar76._24_4_ = fVar238 * fStack_588;
          auVar76._28_4_ = fStack_844;
          _local_6e0 = vsubps_avx(auVar76,auVar278);
          auVar253._0_4_ = local_840 + fVar215 * fVar232;
          auVar253._4_4_ = fStack_83c + fVar234 * fVar258;
          auVar253._8_4_ = fStack_838 + fVar260 * fVar287;
          auVar253._12_4_ = aStack_834.w + fVar290 * fVar309;
          auVar253._16_4_ = fStack_830 + fVar313 * fVar325;
          auVar253._20_4_ = fStack_82c + fVar327 * fVar262;
          auVar253._24_4_ = fStack_828 + fVar21 * fVar264;
          auVar253._28_4_ = fStack_824 + fStack_8e4 + 0.0;
          auVar77._4_4_ = fStack_5bc * fVar217;
          auVar77._0_4_ = local_5c0 * fVar194;
          auVar77._8_4_ = fStack_5b8 * fVar218;
          auVar77._12_4_ = fStack_5b4 * fVar219;
          auVar77._16_4_ = fStack_5b0 * fVar220;
          auVar77._20_4_ = fStack_5ac * fVar236;
          auVar77._24_4_ = fStack_5a8 * fVar238;
          auVar77._28_4_ = local_6e0._28_4_;
          _local_700 = vsubps_avx(auVar77,auVar253);
          auVar17 = vcmpps_avx(auVar16,_DAT_01faff00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar251 = vblendvps_avx(auVar254,auVar71,auVar17);
          auVar357._8_4_ = 0x7fffffff;
          auVar357._0_8_ = 0x7fffffff7fffffff;
          auVar357._12_4_ = 0x7fffffff;
          auVar357._16_4_ = 0x7fffffff;
          auVar357._20_4_ = 0x7fffffff;
          auVar357._24_4_ = 0x7fffffff;
          auVar357._28_4_ = 0x7fffffff;
          auVar16 = vandps_avx(auVar357,local_2e0);
          auVar16 = vmaxps_avx(local_480,auVar16);
          auVar78._4_4_ = auVar16._4_4_ * 1.9073486e-06;
          auVar78._0_4_ = auVar16._0_4_ * 1.9073486e-06;
          auVar78._8_4_ = auVar16._8_4_ * 1.9073486e-06;
          auVar78._12_4_ = auVar16._12_4_ * 1.9073486e-06;
          auVar78._16_4_ = auVar16._16_4_ * 1.9073486e-06;
          auVar78._20_4_ = auVar16._20_4_ * 1.9073486e-06;
          auVar78._24_4_ = auVar16._24_4_ * 1.9073486e-06;
          auVar78._28_4_ = auVar16._28_4_;
          auVar16 = vandps_avx(auVar357,local_4a0);
          auVar16 = vcmpps_avx(auVar16,auVar78,1);
          auVar279._8_4_ = 0xff800000;
          auVar279._0_8_ = 0xff800000ff800000;
          auVar279._12_4_ = 0xff800000;
          auVar279._16_4_ = 0xff800000;
          auVar279._20_4_ = 0xff800000;
          auVar279._24_4_ = 0xff800000;
          auVar279._28_4_ = 0xff800000;
          auVar276 = vblendvps_avx(auVar279,auVar72,auVar17);
          auVar18 = auVar17 & auVar16;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            auVar165 = vandps_avx(auVar16,auVar17);
            auVar102 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
            auVar16 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,2);
            auVar401._8_4_ = 0xff800000;
            auVar401._0_8_ = 0xff800000ff800000;
            auVar401._12_4_ = 0xff800000;
            auVar401._16_4_ = 0xff800000;
            auVar401._20_4_ = 0xff800000;
            auVar401._24_4_ = 0xff800000;
            auVar401._28_4_ = 0xff800000;
            auVar392._8_4_ = 0x7f800000;
            auVar392._0_8_ = 0x7f8000007f800000;
            auVar392._12_4_ = 0x7f800000;
            auVar392._16_4_ = 0x7f800000;
            auVar392._20_4_ = 0x7f800000;
            auVar392._24_4_ = 0x7f800000;
            auVar392._28_4_ = 0x7f800000;
            auVar15 = vblendvps_avx(auVar392,auVar401,auVar16);
            auVar27 = vpmovsxwd_avx(auVar102);
            auVar102 = vpunpckhwd_avx(auVar102,auVar102);
            auVar359._16_16_ = auVar102;
            auVar359._0_16_ = auVar27;
            auVar251 = vblendvps_avx(auVar251,auVar15,auVar359);
            auVar15 = vblendvps_avx(auVar401,auVar392,auVar16);
            auVar276 = vblendvps_avx(auVar276,auVar15,auVar359);
            auVar15 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar125._0_4_ = auVar15._0_4_ ^ auVar165._0_4_;
            auVar125._4_4_ = auVar15._4_4_ ^ auVar165._4_4_;
            auVar125._8_4_ = auVar15._8_4_ ^ auVar165._8_4_;
            auVar125._12_4_ = auVar15._12_4_ ^ auVar165._12_4_;
            auVar125._16_4_ = auVar15._16_4_ ^ auVar165._16_4_;
            auVar125._20_4_ = auVar15._20_4_ ^ auVar165._20_4_;
            auVar125._24_4_ = auVar15._24_4_ ^ auVar165._24_4_;
            auVar125._28_4_ = auVar15._28_4_ ^ auVar165._28_4_;
            auVar165 = vorps_avx(auVar16,auVar125);
            auVar165 = vandps_avx(auVar17,auVar165);
          }
        }
        auVar305 = ZEXT3264(auVar111);
        fVar194 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar332._4_4_ = fVar194;
        auVar332._0_4_ = fVar194;
        auVar332._8_4_ = fVar194;
        auVar332._12_4_ = fVar194;
        auVar332._16_4_ = fVar194;
        auVar332._20_4_ = fVar194;
        auVar332._24_4_ = fVar194;
        local_7c0._28_4_ = fVar194;
        local_7c0._0_28_ = auVar332;
        auVar336 = ZEXT3264(local_7c0);
        fVar214 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar358._4_4_ = fVar214;
        auVar358._0_4_ = fVar214;
        auVar358._8_4_ = fVar214;
        auVar358._12_4_ = fVar214;
        auVar358._16_4_ = fVar214;
        auVar358._20_4_ = fVar214;
        auVar358._24_4_ = fVar214;
        auVar358._28_4_ = fVar214;
        auVar360 = ZEXT3264(auVar358);
        fVar215 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar379._4_4_ = fVar215;
        auVar379._0_4_ = fVar215;
        auVar379._8_4_ = fVar215;
        auVar379._12_4_ = fVar215;
        auVar379._16_4_ = fVar215;
        auVar379._20_4_ = fVar215;
        auVar379._24_4_ = fVar215;
        auVar379._28_4_ = fVar215;
        auVar381 = ZEXT3264(auVar379);
        local_4e0 = local_640;
        local_4c0 = vminps_avx(local_500,auVar251);
        _local_520 = vmaxps_avx(local_640,auVar276);
        auVar280 = ZEXT3264(_local_520);
        auVar15 = vcmpps_avx(local_640,local_4c0,2);
        local_5e0 = vandps_avx(auVar15,auVar111);
        auVar256 = ZEXT3264(local_5e0);
        auVar15 = vcmpps_avx(_local_520,local_500,2);
        auVar111 = vandps_avx(auVar15,auVar111);
        auVar367 = ZEXT3264(auVar111);
        auVar15 = vorps_avx(auVar111,local_5e0);
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          _local_720 = _local_520;
          auVar16 = _local_720;
          auVar15 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_620._0_4_ = auVar165._0_4_ ^ auVar15._0_4_;
          local_620._4_4_ = auVar165._4_4_ ^ auVar15._4_4_;
          fStack_618 = (float)(auVar165._8_4_ ^ auVar15._8_4_);
          fStack_614 = (float)(auVar165._12_4_ ^ auVar15._12_4_);
          fStack_610 = (float)(auVar165._16_4_ ^ auVar15._16_4_);
          fStack_60c = (float)(auVar165._20_4_ ^ auVar15._20_4_);
          fStack_608 = (float)(auVar165._24_4_ ^ auVar15._24_4_);
          fStack_604 = (float)((uint)auVar165._28_4_ ^ auVar15._28_4_);
          auVar118._0_4_ =
               fVar194 * auVar157._0_4_ + fVar214 * auVar181._0_4_ + fVar215 * auVar206._0_4_;
          auVar118._4_4_ =
               fVar194 * auVar157._4_4_ + fVar214 * auVar181._4_4_ + fVar215 * auVar206._4_4_;
          auVar118._8_4_ =
               fVar194 * auVar157._8_4_ + fVar214 * auVar181._8_4_ + fVar215 * auVar206._8_4_;
          auVar118._12_4_ =
               fVar194 * auVar157._12_4_ + fVar214 * auVar181._12_4_ + fVar215 * auVar206._12_4_;
          auVar118._16_4_ =
               fVar194 * auVar157._16_4_ + fVar214 * auVar181._16_4_ + fVar215 * auVar206._16_4_;
          auVar118._20_4_ =
               fVar194 * auVar157._20_4_ + fVar214 * auVar181._20_4_ + fVar215 * auVar206._20_4_;
          auVar118._24_4_ =
               fVar194 * auVar157._24_4_ + fVar214 * auVar181._24_4_ + fVar215 * auVar206._24_4_;
          auVar118._28_4_ = auVar165._28_4_ + auVar157._28_4_ + auVar181._28_4_;
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar159._16_4_ = 0x7fffffff;
          auVar159._20_4_ = 0x7fffffff;
          auVar159._24_4_ = 0x7fffffff;
          auVar159._28_4_ = 0x7fffffff;
          auVar165 = vandps_avx(auVar118,auVar159);
          auVar160._8_4_ = 0x3e99999a;
          auVar160._0_8_ = 0x3e99999a3e99999a;
          auVar160._12_4_ = 0x3e99999a;
          auVar160._16_4_ = 0x3e99999a;
          auVar160._20_4_ = 0x3e99999a;
          auVar160._24_4_ = 0x3e99999a;
          auVar160._28_4_ = 0x3e99999a;
          auVar165 = vcmpps_avx(auVar165,auVar160,1);
          auVar165 = vorps_avx(auVar165,_local_620);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar165 = vblendvps_avx(auVar184,auVar161,auVar165);
          local_660 = ZEXT432(local_b0c);
          auVar27 = vpshufd_avx(ZEXT416(local_b0c),0);
          auVar190 = ZEXT1664(auVar27);
          auVar102 = vpcmpgtd_avx(auVar165._16_16_,auVar27);
          local_680 = auVar27._0_4_;
          fStack_67c = auVar27._4_4_;
          fStack_678 = auVar27._8_4_;
          fStack_674 = auVar27._12_4_;
          auVar27 = vpcmpgtd_avx(auVar165._0_16_,auVar27);
          auVar162._16_16_ = auVar102;
          auVar162._0_16_ = auVar27;
          local_600 = vblendps_avx(ZEXT1632(auVar27),auVar162,0xf0);
          local_560 = vandnps_avx(local_600,local_5e0);
          auVar305 = ZEXT3264(local_560);
          auVar165 = local_5e0 & ~local_600;
          local_820 = auVar19;
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar165 >> 0x7f,0) == '\0') &&
                (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar165 >> 0xbf,0) == '\0') &&
              (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar165[0x1f]) {
            fVar194 = (ray->super_RayK<1>).tfar;
            auVar119._4_4_ = fVar194;
            auVar119._0_4_ = fVar194;
            auVar119._8_4_ = fVar194;
            auVar119._12_4_ = fVar194;
            auVar119._16_4_ = fVar194;
            auVar119._20_4_ = fVar194;
            auVar119._24_4_ = fVar194;
            auVar119._28_4_ = fVar194;
            local_720._0_4_ = local_520._0_4_;
            local_720._4_4_ = local_520._4_4_;
            fStack_718 = local_520._8_4_;
            fStack_714 = local_520._12_4_;
            fStack_710 = local_520._16_4_;
            fStack_70c = local_520._20_4_;
            fStack_708 = local_520._24_4_;
            fStack_704 = local_520._28_4_;
            local_8a0 = _local_520;
            fVar194 = (float)local_720._0_4_;
            fVar214 = (float)local_720._4_4_;
            fVar215 = fStack_718;
            fVar216 = fStack_714;
            fVar217 = fStack_710;
            fVar218 = fStack_70c;
            fVar219 = fStack_708;
            fVar220 = fStack_704;
            _local_720 = auVar16;
          }
          else {
            local_920._0_4_ = uVar95;
            auVar190 = ZEXT3264(local_640);
            local_7e0._4_4_ = local_640._4_4_ + (float)local_760._4_4_;
            local_7e0._0_4_ = local_640._0_4_ + (float)local_760._0_4_;
            fStack_7d8 = local_640._8_4_ + fStack_758;
            fStack_7d4 = local_640._12_4_ + fStack_754;
            fStack_7d0 = local_640._16_4_ + fStack_750;
            fStack_7cc = local_640._20_4_ + fStack_74c;
            fStack_7c8 = local_640._24_4_ + fStack_748;
            fStack_7c4 = local_640._28_4_ + fStack_744;
            _local_6a0 = auVar358;
            local_9c0 = auVar111;
            local_9e0 = auVar379;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar111 = auVar305._0_32_;
              auVar165 = vblendvps_avx(auVar120,auVar190._0_32_,auVar111);
              auVar15 = vshufps_avx(auVar165,auVar165,0xb1);
              auVar15 = vminps_avx(auVar165,auVar15);
              auVar16 = vshufpd_avx(auVar15,auVar15,5);
              auVar15 = vminps_avx(auVar15,auVar16);
              auVar16 = vperm2f128_avx(auVar15,auVar15,1);
              auVar15 = vminps_avx(auVar15,auVar16);
              auVar165 = vcmpps_avx(auVar165,auVar15,0);
              auVar15 = auVar111 & auVar165;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar165,auVar111);
              }
              uVar88 = vmovmskps_avx(auVar111);
              uVar92 = 0;
              if (uVar88 != 0) {
                for (; (uVar88 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar89 = (ulong)uVar92;
              *(undefined4 *)(local_560 + uVar89 * 4) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar2.x;
              fStack_83c = aVar2.y;
              fStack_838 = aVar2.z;
              aStack_834 = aVar2.field_3;
              auVar102 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              fVar194 = local_1a0[uVar89];
              uVar92 = *(uint *)(local_4e0 + uVar89 * 4);
              if (auVar102._0_4_ < 0.0) {
                fVar214 = sqrtf(auVar102._0_4_);
              }
              else {
                auVar102 = vsqrtss_avx(auVar102,auVar102);
                fVar214 = auVar102._0_4_;
              }
              auVar27 = vminps_avx(_local_9f0,_local_a10);
              auVar102 = vmaxps_avx(_local_9f0,_local_a10);
              auVar107 = vminps_avx(_local_a00,_local_a20);
              auVar147 = vminps_avx(auVar27,auVar107);
              auVar27 = vmaxps_avx(_local_a00,_local_a20);
              auVar107 = vmaxps_avx(auVar102,auVar27);
              auVar196._8_4_ = 0x7fffffff;
              auVar196._0_8_ = 0x7fffffff7fffffff;
              auVar196._12_4_ = 0x7fffffff;
              auVar102 = vandps_avx(auVar147,auVar196);
              auVar27 = vandps_avx(auVar107,auVar196);
              auVar102 = vmaxps_avx(auVar102,auVar27);
              auVar27 = vmovshdup_avx(auVar102);
              auVar27 = vmaxss_avx(auVar27,auVar102);
              auVar102 = vshufpd_avx(auVar102,auVar102,1);
              auVar102 = vmaxss_avx(auVar102,auVar27);
              local_860 = auVar102._0_4_ * 1.9073486e-06;
              local_8c0._0_4_ = fVar214 * 1.9073486e-06;
              _local_7a0 = vshufps_avx(auVar107,auVar107,0xff);
              auVar102 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar194),0x10);
              auVar336 = ZEXT1664(auVar102);
              lVar96 = 5;
              do {
                auVar331 = auVar336._0_16_;
                auVar27 = vmovshdup_avx(auVar331);
                fVar219 = auVar27._0_4_;
                fVar218 = 1.0 - fVar219;
                fVar194 = fVar218 * fVar218;
                fVar214 = fVar218 * fVar194;
                fVar215 = fVar219 * fVar219;
                fVar216 = fVar219 * fVar215;
                fVar217 = fVar219 * fVar218;
                auVar102 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.16666667)),
                                       ZEXT416((uint)(fVar216 * 0.16666667)),0);
                auVar107 = ZEXT416((uint)((fVar216 * 4.0 + fVar214 +
                                          fVar219 * fVar217 * 12.0 + fVar218 * fVar217 * 6.0) *
                                         0.16666667));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar147 = ZEXT416((uint)((fVar214 * 4.0 + fVar216 +
                                          fVar218 * fVar217 * 12.0 + fVar219 * fVar217 * 6.0) *
                                         0.16666667));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar106 = vshufps_avx(auVar331,auVar331,0);
                auVar172._0_4_ = auVar106._0_4_ * local_840 + 0.0;
                auVar172._4_4_ = auVar106._4_4_ * fStack_83c + 0.0;
                auVar172._8_4_ = auVar106._8_4_ * fStack_838 + 0.0;
                auVar172._12_4_ = auVar106._12_4_ * aStack_834.w + 0.0;
                auVar106 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                       ZEXT416((uint)(fVar214 * 0.16666667)),0);
                auVar103._0_4_ =
                     auVar106._0_4_ * (float)local_9f0._0_4_ +
                     auVar147._0_4_ * (float)local_a10._0_4_ +
                     auVar102._0_4_ * (float)local_a20._0_4_ +
                     auVar107._0_4_ * (float)local_a00._0_4_;
                auVar103._4_4_ =
                     auVar106._4_4_ * (float)local_9f0._4_4_ +
                     auVar147._4_4_ * (float)local_a10._4_4_ +
                     auVar102._4_4_ * (float)local_a20._4_4_ +
                     auVar107._4_4_ * (float)local_a00._4_4_;
                auVar103._8_4_ =
                     auVar106._8_4_ * fStack_9e8 +
                     auVar147._8_4_ * fStack_a08 +
                     auVar102._8_4_ * fStack_a18 + auVar107._8_4_ * fStack_9f8;
                auVar103._12_4_ =
                     auVar106._12_4_ * fStack_9e4 +
                     auVar147._12_4_ * fStack_a04 +
                     auVar102._12_4_ * fStack_a14 + auVar107._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar103;
                auVar102 = vsubps_avx(auVar172,auVar103);
                _local_a60 = auVar102;
                auVar102 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar214 = auVar102._0_4_;
                if (fVar214 < 0.0) {
                  local_a40._0_16_ = auVar27;
                  local_980._0_4_ = fVar215;
                  local_9a0._0_4_ = fVar194;
                  local_8e0._0_4_ = fVar217;
                  fVar216 = sqrtf(fVar214);
                  fVar194 = (float)local_9a0._0_4_;
                  fVar215 = (float)local_980._0_4_;
                  fVar217 = (float)local_8e0._0_4_;
                  auVar27 = local_a40._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar102,auVar102);
                  fVar216 = auVar107._0_4_;
                }
                fVar219 = auVar27._0_4_;
                auVar27 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.5)),ZEXT416((uint)(fVar215 * 0.5)),
                                      0);
                auVar107 = ZEXT416((uint)((fVar194 + fVar217 * 4.0) * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar147 = ZEXT416((uint)((fVar219 * -fVar219 - fVar217 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar106 = ZEXT416((uint)(fVar218 * -fVar218 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar318._0_4_ =
                     (float)local_9f0._0_4_ * auVar106._0_4_ +
                     (float)local_a10._0_4_ * auVar147._0_4_ +
                     (float)local_a20._0_4_ * auVar27._0_4_ +
                     (float)local_a00._0_4_ * auVar107._0_4_;
                auVar318._4_4_ =
                     (float)local_9f0._4_4_ * auVar106._4_4_ +
                     (float)local_a10._4_4_ * auVar147._4_4_ +
                     (float)local_a20._4_4_ * auVar27._4_4_ +
                     (float)local_a00._4_4_ * auVar107._4_4_;
                auVar318._8_4_ =
                     fStack_9e8 * auVar106._8_4_ +
                     fStack_a08 * auVar147._8_4_ +
                     fStack_a18 * auVar27._8_4_ + fStack_9f8 * auVar107._8_4_;
                auVar318._12_4_ =
                     fStack_9e4 * auVar106._12_4_ +
                     fStack_a04 * auVar147._12_4_ +
                     fStack_a14 * auVar27._12_4_ + fStack_9f4 * auVar107._12_4_;
                auVar27 = vshufps_avx(auVar331,auVar331,0x55);
                auVar107 = ZEXT416((uint)(fVar218 - (fVar219 + fVar219)));
                auVar147 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)(fVar219 - (fVar218 + fVar218)));
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar4 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                auVar107 = vdpps_avx(auVar318,auVar318,0x7f);
                auVar143._0_4_ =
                     (float)local_9f0._0_4_ * auVar4._0_4_ +
                     (float)local_a10._0_4_ * auVar106._0_4_ +
                     (float)local_a20._0_4_ * auVar27._0_4_ +
                     (float)local_a00._0_4_ * auVar147._0_4_;
                auVar143._4_4_ =
                     (float)local_9f0._4_4_ * auVar4._4_4_ +
                     (float)local_a10._4_4_ * auVar106._4_4_ +
                     (float)local_a20._4_4_ * auVar27._4_4_ +
                     (float)local_a00._4_4_ * auVar147._4_4_;
                auVar143._8_4_ =
                     fStack_9e8 * auVar4._8_4_ +
                     fStack_a08 * auVar106._8_4_ +
                     fStack_a18 * auVar27._8_4_ + fStack_9f8 * auVar147._8_4_;
                auVar143._12_4_ =
                     fStack_9e4 * auVar4._12_4_ +
                     fStack_a04 * auVar106._12_4_ +
                     fStack_a14 * auVar27._12_4_ + fStack_9f4 * auVar147._12_4_;
                auVar27 = vblendps_avx(auVar107,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar27,auVar27);
                fVar215 = auVar147._0_4_;
                fVar194 = auVar107._0_4_;
                auVar147 = vdpps_avx(auVar318,auVar143,0x7f);
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar106._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar106._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar106._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar106._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar221._0_4_ = auVar318._0_4_ * auVar147._0_4_;
                auVar221._4_4_ = auVar318._4_4_ * auVar147._4_4_;
                auVar221._8_4_ = auVar318._8_4_ * auVar147._8_4_;
                auVar221._12_4_ = auVar318._12_4_ * auVar147._12_4_;
                auVar4 = vsubps_avx(auVar144,auVar221);
                auVar147 = vrcpss_avx(auVar27,auVar27);
                auVar27 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(auVar336._0_4_ * (float)local_8c0._0_4_)));
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar194 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar89 = CONCAT44(auVar318._4_4_,auVar318._0_4_);
                auVar243._0_8_ = uVar89 ^ 0x8000000080000000;
                auVar243._8_4_ = -auVar318._8_4_;
                auVar243._12_4_ = -auVar318._12_4_;
                auVar106 = ZEXT416((uint)(fVar215 * 1.5 +
                                         fVar194 * -0.5 * fVar215 * fVar215 * fVar215));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar197._0_4_ = auVar106._0_4_ * auVar4._0_4_ * auVar147._0_4_;
                auVar197._4_4_ = auVar106._4_4_ * auVar4._4_4_ * auVar147._4_4_;
                auVar197._8_4_ = auVar106._8_4_ * auVar4._8_4_ * auVar147._8_4_;
                auVar197._12_4_ = auVar106._12_4_ * auVar4._12_4_ * auVar147._12_4_;
                auVar269._0_4_ = auVar318._0_4_ * auVar106._0_4_;
                auVar269._4_4_ = auVar318._4_4_ * auVar106._4_4_;
                auVar269._8_4_ = auVar318._8_4_ * auVar106._8_4_;
                auVar269._12_4_ = auVar318._12_4_ * auVar106._12_4_;
                local_a40._0_4_ = auVar27._0_4_;
                if (fVar194 < 0.0) {
                  local_980._0_4_ = fVar216;
                  local_9a0._0_16_ = auVar243;
                  local_8e0._0_16_ = auVar269;
                  local_820._0_16_ = auVar197;
                  fVar215 = sqrtf(fVar194);
                  auVar197 = local_820._0_16_;
                  auVar243 = local_9a0._0_16_;
                  auVar269 = local_8e0._0_16_;
                  fVar194 = (float)local_a40._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar215 = auVar107._0_4_;
                  local_980._0_4_ = fVar216;
                  fVar194 = auVar27._0_4_;
                }
                auVar27 = vdpps_avx(_local_a60,auVar269,0x7f);
                fVar215 = (local_860 / fVar215) * ((float)local_980._0_4_ + 1.0) +
                          fVar194 + (float)local_980._0_4_ * local_860;
                auVar107 = vdpps_avx(auVar243,auVar269,0x7f);
                auVar147 = vdpps_avx(_local_a60,auVar197,0x7f);
                auVar83._4_4_ = fStack_83c;
                auVar83._0_4_ = local_840;
                auVar83._8_4_ = fStack_838;
                auVar83._12_4_ = aStack_834.a;
                auVar106 = vdpps_avx(auVar83,auVar269,0x7f);
                auVar4 = vdpps_avx(_local_a60,auVar243,0x7f);
                fVar216 = auVar107._0_4_ + auVar147._0_4_;
                fVar217 = auVar27._0_4_;
                auVar104._0_4_ = fVar217 * fVar217;
                auVar104._4_4_ = auVar27._4_4_ * auVar27._4_4_;
                auVar104._8_4_ = auVar27._8_4_ * auVar27._8_4_;
                auVar104._12_4_ = auVar27._12_4_ * auVar27._12_4_;
                auVar147 = vsubps_avx(auVar102,auVar104);
                local_980._0_16_ = ZEXT416((uint)fVar216);
                auVar107 = vdpps_avx(_local_a60,auVar83,0x7f);
                fVar218 = auVar4._0_4_ - fVar217 * fVar216;
                fVar217 = auVar107._0_4_ - fVar217 * auVar106._0_4_;
                auVar107 = vrsqrtss_avx(auVar147,auVar147);
                fVar219 = auVar147._0_4_;
                fVar216 = auVar107._0_4_;
                fVar216 = fVar216 * 1.5 + fVar219 * -0.5 * fVar216 * fVar216 * fVar216;
                if (fVar219 < 0.0) {
                  local_9a0._0_16_ = auVar27;
                  local_8e0._0_4_ = fVar215;
                  local_820._0_16_ = auVar106;
                  local_780._0_4_ = fVar218;
                  local_900._0_4_ = fVar217;
                  local_8a0._0_4_ = fVar216;
                  fVar219 = sqrtf(fVar219);
                  fVar216 = (float)local_8a0._0_4_;
                  fVar218 = (float)local_780._0_4_;
                  fVar217 = (float)local_900._0_4_;
                  auVar106 = local_820._0_16_;
                  auVar27 = local_9a0._0_16_;
                  fVar215 = (float)local_8e0._0_4_;
                  fVar194 = (float)local_a40._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar147,auVar147);
                  fVar219 = auVar107._0_4_;
                }
                auVar367 = ZEXT3264(local_9c0);
                auVar4 = vpermilps_avx(local_880._0_16_,0xff);
                auVar5 = vshufps_avx(auVar318,auVar318,0xff);
                fVar220 = fVar218 * fVar216 - auVar5._0_4_;
                auVar222._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar222._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar222._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar244._0_4_ = -fVar220;
                auVar244._4_4_ = 0x80000000;
                auVar244._8_4_ = 0x80000000;
                auVar244._12_4_ = 0x80000000;
                auVar256 = ZEXT1664(auVar244);
                fVar218 = local_980._0_4_ * fVar217 * fVar216;
                auVar280 = ZEXT464((uint)fVar218);
                auVar107 = vinsertps_avx(auVar244,ZEXT416((uint)(fVar217 * fVar216)),0x1c);
                auVar106 = vmovsldup_avx(ZEXT416((uint)(fVar218 - auVar106._0_4_ * fVar220)));
                auVar107 = vdivps_avx(auVar107,auVar106);
                auVar147 = vinsertps_avx(local_980._0_16_,auVar222,0x10);
                auVar147 = vdivps_avx(auVar147,auVar106);
                auVar106 = vmovsldup_avx(auVar27);
                auVar109 = ZEXT416((uint)(fVar219 - auVar4._0_4_));
                auVar4 = vmovsldup_avx(auVar109);
                auVar173._0_4_ = auVar106._0_4_ * auVar107._0_4_ + auVar4._0_4_ * auVar147._0_4_;
                auVar173._4_4_ = auVar106._4_4_ * auVar107._4_4_ + auVar4._4_4_ * auVar147._4_4_;
                auVar173._8_4_ = auVar106._8_4_ * auVar107._8_4_ + auVar4._8_4_ * auVar147._8_4_;
                auVar173._12_4_ =
                     auVar106._12_4_ * auVar107._12_4_ + auVar4._12_4_ * auVar147._12_4_;
                auVar107 = vsubps_avx(auVar331,auVar173);
                auVar336 = ZEXT1664(auVar107);
                auVar174._8_4_ = 0x7fffffff;
                auVar174._0_8_ = 0x7fffffff7fffffff;
                auVar174._12_4_ = 0x7fffffff;
                auVar27 = vandps_avx(auVar27,auVar174);
                if (auVar27._0_4_ < fVar215) {
                  auVar198._8_4_ = 0x7fffffff;
                  auVar198._0_8_ = 0x7fffffff7fffffff;
                  auVar198._12_4_ = 0x7fffffff;
                  auVar27 = vandps_avx(auVar109,auVar198);
                  if (auVar27._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + fVar194 + fVar215) {
                    fVar194 = auVar107._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar194) {
                      fVar215 = (ray->super_RayK<1>).tfar;
                      auVar280 = ZEXT464((uint)fVar215);
                      if (fVar194 <= fVar215) {
                        auVar27 = vmovshdup_avx(auVar107);
                        fVar216 = auVar27._0_4_;
                        if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
                          auVar102 = vrsqrtss_avx(auVar102,auVar102);
                          fVar217 = auVar102._0_4_;
                          auVar256 = ZEXT464((uint)(fVar214 * -0.5));
                          pGVar10 = (context->scene->geometries).items[uVar91].ptr;
                          if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar102 = ZEXT416((uint)(fVar217 * 1.5 +
                                                     fVar214 * -0.5 * fVar217 * fVar217 * fVar217));
                            auVar102 = vshufps_avx(auVar102,auVar102,0);
                            auVar199._0_4_ = auVar102._0_4_ * (float)local_a60._0_4_;
                            auVar199._4_4_ = auVar102._4_4_ * (float)local_a60._4_4_;
                            auVar199._8_4_ = auVar102._8_4_ * fStack_a58;
                            auVar199._12_4_ = auVar102._12_4_ * fStack_a54;
                            auVar145._0_4_ = auVar318._0_4_ + auVar5._0_4_ * auVar199._0_4_;
                            auVar145._4_4_ = auVar318._4_4_ + auVar5._4_4_ * auVar199._4_4_;
                            auVar145._8_4_ = auVar318._8_4_ + auVar5._8_4_ * auVar199._8_4_;
                            auVar145._12_4_ = auVar318._12_4_ + auVar5._12_4_ * auVar199._12_4_;
                            auVar102 = vshufps_avx(auVar199,auVar199,0xc9);
                            auVar27 = vshufps_avx(auVar318,auVar318,0xc9);
                            auVar200._0_4_ = auVar27._0_4_ * auVar199._0_4_;
                            auVar200._4_4_ = auVar27._4_4_ * auVar199._4_4_;
                            auVar200._8_4_ = auVar27._8_4_ * auVar199._8_4_;
                            auVar200._12_4_ = auVar27._12_4_ * auVar199._12_4_;
                            auVar223._0_4_ = auVar318._0_4_ * auVar102._0_4_;
                            auVar223._4_4_ = auVar318._4_4_ * auVar102._4_4_;
                            auVar223._8_4_ = auVar318._8_4_ * auVar102._8_4_;
                            auVar223._12_4_ = auVar318._12_4_ * auVar102._12_4_;
                            auVar147 = vsubps_avx(auVar223,auVar200);
                            auVar102 = vshufps_avx(auVar147,auVar147,0xc9);
                            auVar27 = vshufps_avx(auVar145,auVar145,0xc9);
                            auVar256 = ZEXT1664(auVar27);
                            auVar224._0_4_ = auVar27._0_4_ * auVar102._0_4_;
                            auVar224._4_4_ = auVar27._4_4_ * auVar102._4_4_;
                            auVar224._8_4_ = auVar27._8_4_ * auVar102._8_4_;
                            auVar224._12_4_ = auVar27._12_4_ * auVar102._12_4_;
                            auVar102 = vshufps_avx(auVar147,auVar147,0xd2);
                            auVar146._0_4_ = auVar145._0_4_ * auVar102._0_4_;
                            auVar146._4_4_ = auVar145._4_4_ * auVar102._4_4_;
                            auVar146._8_4_ = auVar145._8_4_ * auVar102._8_4_;
                            auVar146._12_4_ = auVar145._12_4_ * auVar102._12_4_;
                            auVar102 = vsubps_avx(auVar224,auVar146);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar194;
                              auVar27 = vshufps_avx(auVar102,auVar102,0xe9);
                              uVar1 = vmovlps_avx(auVar27);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                              (ray->Ng).field_0.field_0.z = auVar102._0_4_;
                              ray->u = fVar216;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar91;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar147 = vshufps_avx(auVar102,auVar102,0xe9);
                              local_960 = vmovlps_avx(auVar147);
                              local_958 = auVar102._0_4_;
                              local_954 = fVar216;
                              local_950 = 0;
                              local_94c = local_920._0_4_;
                              local_948 = uVar91;
                              local_944 = context->user->instID[0];
                              local_940 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar194;
                              local_740._0_4_ = 0xffffffff;
                              local_a98.valid = (int *)local_740;
                              local_a98.geometryUserPtr = pGVar10->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_960;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010117d1:
                                p_Var11 = context->args->filter;
                                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar256 = ZEXT1664(auVar256._0_16_);
                                  auVar280 = ZEXT1664(auVar280._0_16_);
                                  auVar336 = ZEXT1664(auVar336._0_16_);
                                  (*p_Var11)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_01011863;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar256 = ZEXT1664(auVar27);
                                auVar280 = ZEXT464((uint)fVar215);
                                auVar336 = ZEXT1664(auVar107);
                                (*pGVar10->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_010117d1;
LAB_01011863:
                                (ray->super_RayK<1>).tfar = fVar215;
                              }
                              auVar367 = ZEXT3264(local_9c0);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              auVar165 = local_560;
              fVar194 = (ray->super_RayK<1>).tfar;
              auVar119._4_4_ = fVar194;
              auVar119._0_4_ = fVar194;
              auVar119._8_4_ = fVar194;
              auVar119._12_4_ = fVar194;
              auVar119._16_4_ = fVar194;
              auVar119._20_4_ = fVar194;
              auVar119._24_4_ = fVar194;
              auVar119._28_4_ = fVar194;
              auVar111 = vcmpps_avx(_local_7e0,auVar119,2);
              local_560 = vandps_avx(auVar111,local_560);
              auVar305 = ZEXT3264(local_560);
              auVar165 = auVar165 & auVar111;
              auVar190 = ZEXT3264(local_640);
              auVar332 = local_7c0._0_28_;
            } while ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar165 >> 0x7f,0) != '\0') ||
                       (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar165 >> 0xbf,0) != '\0') ||
                     (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar165[0x1f] < '\0');
            auVar305 = ZEXT3264(_local_520);
            local_8a0 = _local_520;
            auVar360 = ZEXT3264(_local_6a0);
            auVar381 = ZEXT3264(local_9e0);
            uVar95 = local_920._0_4_;
            fVar194 = (float)local_720._0_4_;
            fVar214 = (float)local_720._4_4_;
            fVar215 = fStack_718;
            fVar216 = fStack_714;
            fVar217 = fStack_710;
            fVar218 = fStack_70c;
            fVar219 = fStack_708;
            fVar220 = fStack_704;
          }
          auVar163._0_4_ =
               auVar332._0_4_ * (float)local_6c0._0_4_ +
               auVar360._0_4_ * (float)local_6e0._0_4_ + auVar381._0_4_ * (float)local_700._0_4_;
          auVar163._4_4_ =
               auVar332._4_4_ * (float)local_6c0._4_4_ +
               auVar360._4_4_ * (float)local_6e0._4_4_ + auVar381._4_4_ * (float)local_700._4_4_;
          auVar163._8_4_ =
               auVar332._8_4_ * fStack_6b8 +
               auVar360._8_4_ * fStack_6d8 + auVar381._8_4_ * fStack_6f8;
          auVar163._12_4_ =
               auVar332._12_4_ * fStack_6b4 +
               auVar360._12_4_ * fStack_6d4 + auVar381._12_4_ * fStack_6f4;
          auVar163._16_4_ =
               auVar332._16_4_ * fStack_6b0 +
               auVar360._16_4_ * fStack_6d0 + auVar381._16_4_ * fStack_6f0;
          auVar163._20_4_ =
               auVar332._20_4_ * fStack_6ac +
               auVar360._20_4_ * fStack_6cc + auVar381._20_4_ * fStack_6ec;
          auVar163._24_4_ =
               auVar332._24_4_ * fStack_6a8 +
               auVar360._24_4_ * fStack_6c8 + auVar381._24_4_ * fStack_6e8;
          auVar163._28_4_ = auVar190._28_4_ + auVar190._28_4_ + auVar305._28_4_;
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar185._16_4_ = 0x7fffffff;
          auVar185._20_4_ = 0x7fffffff;
          auVar185._24_4_ = 0x7fffffff;
          auVar185._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar163,auVar185);
          auVar186._8_4_ = 0x3e99999a;
          auVar186._0_8_ = 0x3e99999a3e99999a;
          auVar186._12_4_ = 0x3e99999a;
          auVar186._16_4_ = 0x3e99999a;
          auVar186._20_4_ = 0x3e99999a;
          auVar186._24_4_ = 0x3e99999a;
          auVar186._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar186,1);
          auVar165 = vorps_avx(auVar111,_local_620);
          auVar187._0_4_ = (float)local_760._0_4_ + fVar194;
          auVar187._4_4_ = (float)local_760._4_4_ + fVar214;
          auVar187._8_4_ = fStack_758 + fVar215;
          auVar187._12_4_ = fStack_754 + fVar216;
          auVar187._16_4_ = fStack_750 + fVar217;
          auVar187._20_4_ = fStack_74c + fVar218;
          auVar187._24_4_ = fStack_748 + fVar219;
          auVar187._28_4_ = fStack_744 + fVar220;
          auVar111 = vcmpps_avx(auVar187,auVar119,2);
          _local_7e0 = vandps_avx(auVar367._0_32_,auVar111);
          auVar188._8_4_ = 3;
          auVar188._0_8_ = 0x300000003;
          auVar188._12_4_ = 3;
          auVar188._16_4_ = 3;
          auVar188._20_4_ = 3;
          auVar188._24_4_ = 3;
          auVar188._28_4_ = 3;
          auVar213._8_4_ = 2;
          auVar213._0_8_ = 0x200000002;
          auVar213._12_4_ = 2;
          auVar213._16_4_ = 2;
          auVar213._20_4_ = 2;
          auVar213._24_4_ = 2;
          auVar213._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar213,auVar188,auVar165);
          auVar86._4_4_ = fStack_67c;
          auVar86._0_4_ = local_680;
          auVar86._8_4_ = fStack_678;
          auVar86._12_4_ = fStack_674;
          auVar102 = vpcmpgtd_avx(auVar111._16_16_,auVar86);
          auVar27 = vpshufd_avx(local_660._0_16_,0);
          auVar27 = vpcmpgtd_avx(auVar111._0_16_,auVar27);
          auVar189._16_16_ = auVar102;
          auVar189._0_16_ = auVar119._0_16_;
          local_7c0 = vblendps_avx(ZEXT1632(auVar27),auVar189,0xf0);
          local_740 = vandnps_avx(local_7c0,_local_7e0);
          auVar111 = _local_7e0 & ~local_7c0;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            local_920._0_4_ = uVar95;
            local_7a0._4_4_ = (float)local_760._4_4_ + local_520._4_4_;
            local_7a0._0_4_ = (float)local_760._0_4_ + local_520._0_4_;
            fStack_798 = fStack_758 + local_520._8_4_;
            fStack_794 = fStack_754 + local_520._12_4_;
            fStack_790 = fStack_750 + local_520._16_4_;
            fStack_78c = fStack_74c + local_520._20_4_;
            fStack_788 = fStack_748 + local_520._24_4_;
            fStack_784 = fStack_744 + local_520._28_4_;
            local_8a0 = _local_520;
            do {
              auVar121._8_4_ = 0x7f800000;
              auVar121._0_8_ = 0x7f8000007f800000;
              auVar121._12_4_ = 0x7f800000;
              auVar121._16_4_ = 0x7f800000;
              auVar121._20_4_ = 0x7f800000;
              auVar121._24_4_ = 0x7f800000;
              auVar121._28_4_ = 0x7f800000;
              auVar111 = vblendvps_avx(auVar121,local_8a0,local_740);
              auVar165 = vshufps_avx(auVar111,auVar111,0xb1);
              auVar165 = vminps_avx(auVar111,auVar165);
              auVar15 = vshufpd_avx(auVar165,auVar165,5);
              auVar165 = vminps_avx(auVar165,auVar15);
              auVar15 = vperm2f128_avx(auVar165,auVar165,1);
              auVar165 = vminps_avx(auVar165,auVar15);
              auVar165 = vcmpps_avx(auVar111,auVar165,0);
              auVar15 = local_740 & auVar165;
              auVar111 = local_740;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar165,local_740);
              }
              uVar88 = vmovmskps_avx(auVar111);
              uVar92 = 0;
              if (uVar88 != 0) {
                for (; (uVar88 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar89 = (ulong)uVar92;
              *(undefined4 *)(local_740 + uVar89 * 4) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar2.x;
              fStack_83c = aVar2.y;
              fStack_838 = aVar2.z;
              aStack_834 = aVar2.field_3;
              auVar102 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              fVar194 = local_1c0[uVar89];
              uVar92 = *(uint *)(local_500 + uVar89 * 4);
              if (auVar102._0_4_ < 0.0) {
                fVar214 = sqrtf(auVar102._0_4_);
              }
              else {
                auVar102 = vsqrtss_avx(auVar102,auVar102);
                fVar214 = auVar102._0_4_;
              }
              auVar27 = vminps_avx(_local_9f0,_local_a10);
              auVar102 = vmaxps_avx(_local_9f0,_local_a10);
              auVar107 = vminps_avx(_local_a00,_local_a20);
              auVar147 = vminps_avx(auVar27,auVar107);
              auVar27 = vmaxps_avx(_local_a00,_local_a20);
              auVar107 = vmaxps_avx(auVar102,auVar27);
              auVar201._8_4_ = 0x7fffffff;
              auVar201._0_8_ = 0x7fffffff7fffffff;
              auVar201._12_4_ = 0x7fffffff;
              auVar102 = vandps_avx(auVar147,auVar201);
              auVar27 = vandps_avx(auVar107,auVar201);
              auVar102 = vmaxps_avx(auVar102,auVar27);
              auVar27 = vmovshdup_avx(auVar102);
              auVar27 = vmaxss_avx(auVar27,auVar102);
              auVar102 = vshufpd_avx(auVar102,auVar102,1);
              auVar102 = vmaxss_avx(auVar102,auVar27);
              local_860 = auVar102._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar214 * 1.9073486e-06;
              _local_900 = vshufps_avx(auVar107,auVar107,0xff);
              auVar102 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar194),0x10);
              auVar336 = ZEXT1664(auVar102);
              lVar96 = 5;
              do {
                auVar331 = auVar336._0_16_;
                auVar27 = vmovshdup_avx(auVar331);
                fVar194 = auVar27._0_4_;
                fVar219 = 1.0 - fVar194;
                fVar214 = fVar219 * fVar219;
                fVar215 = fVar219 * fVar214;
                fVar216 = fVar194 * fVar194;
                fVar217 = fVar194 * fVar216;
                fVar218 = fVar194 * fVar219;
                auVar102 = vshufps_avx(ZEXT416((uint)(fVar217 * 0.16666667)),
                                       ZEXT416((uint)(fVar217 * 0.16666667)),0);
                auVar107 = ZEXT416((uint)((fVar217 * 4.0 + fVar215 +
                                          fVar194 * fVar218 * 12.0 + fVar219 * fVar218 * 6.0) *
                                         0.16666667));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar147 = ZEXT416((uint)((fVar215 * 4.0 + fVar217 +
                                          fVar219 * fVar218 * 12.0 + fVar194 * fVar218 * 6.0) *
                                         0.16666667));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar106 = vshufps_avx(auVar331,auVar331,0);
                auVar175._0_4_ = auVar106._0_4_ * local_840 + 0.0;
                auVar175._4_4_ = auVar106._4_4_ * fStack_83c + 0.0;
                auVar175._8_4_ = auVar106._8_4_ * fStack_838 + 0.0;
                auVar175._12_4_ = auVar106._12_4_ * aStack_834.w + 0.0;
                auVar106 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.16666667)),
                                       ZEXT416((uint)(fVar215 * 0.16666667)),0);
                auVar105._0_4_ =
                     auVar106._0_4_ * (float)local_9f0._0_4_ +
                     auVar147._0_4_ * (float)local_a10._0_4_ +
                     auVar102._0_4_ * (float)local_a20._0_4_ +
                     auVar107._0_4_ * (float)local_a00._0_4_;
                auVar105._4_4_ =
                     auVar106._4_4_ * (float)local_9f0._4_4_ +
                     auVar147._4_4_ * (float)local_a10._4_4_ +
                     auVar102._4_4_ * (float)local_a20._4_4_ +
                     auVar107._4_4_ * (float)local_a00._4_4_;
                auVar105._8_4_ =
                     auVar106._8_4_ * fStack_9e8 +
                     auVar147._8_4_ * fStack_a08 +
                     auVar102._8_4_ * fStack_a18 + auVar107._8_4_ * fStack_9f8;
                auVar105._12_4_ =
                     auVar106._12_4_ * fStack_9e4 +
                     auVar147._12_4_ * fStack_a04 +
                     auVar102._12_4_ * fStack_a14 + auVar107._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar105;
                auVar102 = vsubps_avx(auVar175,auVar105);
                _local_a60 = auVar102;
                auVar102 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar215 = auVar102._0_4_;
                local_b00 = auVar336._0_4_;
                if (fVar215 < 0.0) {
                  local_a40._0_16_ = auVar27;
                  local_8c0._0_4_ = fVar216;
                  local_9c0._0_4_ = fVar214;
                  local_9e0._0_4_ = fVar218;
                  fVar217 = sqrtf(fVar215);
                  fVar216 = (float)local_8c0._0_4_;
                  fVar214 = (float)local_9c0._0_4_;
                  fVar218 = (float)local_9e0._0_4_;
                  fVar194 = (float)local_a40._0_4_;
                }
                else {
                  auVar27 = vsqrtss_avx(auVar102,auVar102);
                  fVar217 = auVar27._0_4_;
                }
                auVar27 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.5)),ZEXT416((uint)(fVar216 * 0.5)),
                                      0);
                auVar107 = ZEXT416((uint)((fVar214 + fVar218 * 4.0) * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar147 = ZEXT416((uint)((fVar194 * -fVar194 - fVar218 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar106 = ZEXT416((uint)(fVar219 * -fVar219 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar319._0_4_ =
                     (float)local_9f0._0_4_ * auVar106._0_4_ +
                     (float)local_a10._0_4_ * auVar147._0_4_ +
                     (float)local_a20._0_4_ * auVar27._0_4_ +
                     (float)local_a00._0_4_ * auVar107._0_4_;
                auVar319._4_4_ =
                     (float)local_9f0._4_4_ * auVar106._4_4_ +
                     (float)local_a10._4_4_ * auVar147._4_4_ +
                     (float)local_a20._4_4_ * auVar27._4_4_ +
                     (float)local_a00._4_4_ * auVar107._4_4_;
                auVar319._8_4_ =
                     fStack_9e8 * auVar106._8_4_ +
                     fStack_a08 * auVar147._8_4_ +
                     fStack_a18 * auVar27._8_4_ + fStack_9f8 * auVar107._8_4_;
                auVar319._12_4_ =
                     fStack_9e4 * auVar106._12_4_ +
                     fStack_a04 * auVar147._12_4_ +
                     fStack_a14 * auVar27._12_4_ + fStack_9f4 * auVar107._12_4_;
                auVar27 = vshufps_avx(auVar331,auVar331,0x55);
                auVar107 = ZEXT416((uint)(fVar219 - (fVar194 + fVar194)));
                auVar147 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)(fVar194 - (fVar219 + fVar219)));
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar4 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
                auVar107 = vdpps_avx(auVar319,auVar319,0x7f);
                auVar148._0_4_ =
                     (float)local_9f0._0_4_ * auVar4._0_4_ +
                     (float)local_a10._0_4_ * auVar106._0_4_ +
                     (float)local_a20._0_4_ * auVar27._0_4_ +
                     (float)local_a00._0_4_ * auVar147._0_4_;
                auVar148._4_4_ =
                     (float)local_9f0._4_4_ * auVar4._4_4_ +
                     (float)local_a10._4_4_ * auVar106._4_4_ +
                     (float)local_a20._4_4_ * auVar27._4_4_ +
                     (float)local_a00._4_4_ * auVar147._4_4_;
                auVar148._8_4_ =
                     fStack_9e8 * auVar4._8_4_ +
                     fStack_a08 * auVar106._8_4_ +
                     fStack_a18 * auVar27._8_4_ + fStack_9f8 * auVar147._8_4_;
                auVar148._12_4_ =
                     fStack_9e4 * auVar4._12_4_ +
                     fStack_a04 * auVar106._12_4_ +
                     fStack_a14 * auVar27._12_4_ + fStack_9f4 * auVar147._12_4_;
                auVar27 = vblendps_avx(auVar107,_DAT_01f7aa10,0xe);
                auVar147 = vrsqrtss_avx(auVar27,auVar27);
                fVar214 = auVar147._0_4_;
                fVar194 = auVar107._0_4_;
                auVar147 = vdpps_avx(auVar319,auVar148,0x7f);
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar106._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar106._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar106._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar106._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar225._0_4_ = auVar319._0_4_ * auVar147._0_4_;
                auVar225._4_4_ = auVar319._4_4_ * auVar147._4_4_;
                auVar225._8_4_ = auVar319._8_4_ * auVar147._8_4_;
                auVar225._12_4_ = auVar319._12_4_ * auVar147._12_4_;
                auVar4 = vsubps_avx(auVar149,auVar225);
                auVar147 = vrcpss_avx(auVar27,auVar27);
                auVar27 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(local_b00 * (float)local_980._0_4_)));
                auVar360 = ZEXT1664(auVar27);
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar194 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar89 = CONCAT44(auVar319._4_4_,auVar319._0_4_);
                auVar245._0_8_ = uVar89 ^ 0x8000000080000000;
                auVar245._8_4_ = -auVar319._8_4_;
                auVar245._12_4_ = -auVar319._12_4_;
                auVar106 = ZEXT416((uint)(fVar214 * 1.5 +
                                         fVar194 * -0.5 * fVar214 * fVar214 * fVar214));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar202._0_4_ = auVar106._0_4_ * auVar4._0_4_ * auVar147._0_4_;
                auVar202._4_4_ = auVar106._4_4_ * auVar4._4_4_ * auVar147._4_4_;
                auVar202._8_4_ = auVar106._8_4_ * auVar4._8_4_ * auVar147._8_4_;
                auVar202._12_4_ = auVar106._12_4_ * auVar4._12_4_ * auVar147._12_4_;
                auVar270._0_4_ = auVar319._0_4_ * auVar106._0_4_;
                auVar270._4_4_ = auVar319._4_4_ * auVar106._4_4_;
                auVar270._8_4_ = auVar319._8_4_ * auVar106._8_4_;
                auVar270._12_4_ = auVar319._12_4_ * auVar106._12_4_;
                local_a40._0_4_ = auVar27._0_4_;
                if (fVar194 < 0.0) {
                  local_8c0._0_4_ = fVar217;
                  local_9c0._0_16_ = auVar245;
                  local_9e0._0_16_ = auVar270;
                  local_9a0._0_16_ = auVar202;
                  fVar194 = sqrtf(fVar194);
                  auVar360 = ZEXT464((uint)local_a40._0_4_);
                  auVar202 = local_9a0._0_16_;
                  auVar245 = local_9c0._0_16_;
                  auVar270 = local_9e0._0_16_;
                  fVar217 = (float)local_8c0._0_4_;
                }
                else {
                  auVar27 = vsqrtss_avx(auVar107,auVar107);
                  fVar194 = auVar27._0_4_;
                }
                auVar27 = vdpps_avx(_local_a60,auVar270,0x7f);
                fVar194 = (local_860 / fVar194) * (fVar217 + 1.0) +
                          auVar360._0_4_ + fVar217 * local_860;
                auVar107 = vdpps_avx(auVar245,auVar270,0x7f);
                auVar147 = vdpps_avx(_local_a60,auVar202,0x7f);
                auVar84._4_4_ = fStack_83c;
                auVar84._0_4_ = local_840;
                auVar84._8_4_ = fStack_838;
                auVar84._12_4_ = aStack_834.a;
                auVar106 = vdpps_avx(auVar84,auVar270,0x7f);
                auVar4 = vdpps_avx(_local_a60,auVar245,0x7f);
                fVar214 = auVar107._0_4_ + auVar147._0_4_;
                fVar216 = auVar27._0_4_;
                auVar108._0_4_ = fVar216 * fVar216;
                auVar108._4_4_ = auVar27._4_4_ * auVar27._4_4_;
                auVar108._8_4_ = auVar27._8_4_ * auVar27._8_4_;
                auVar108._12_4_ = auVar27._12_4_ * auVar27._12_4_;
                auVar147 = vsubps_avx(auVar102,auVar108);
                auVar107 = vdpps_avx(_local_a60,auVar84,0x7f);
                fVar217 = auVar4._0_4_ - fVar216 * fVar214;
                fVar218 = auVar107._0_4_ - fVar216 * auVar106._0_4_;
                auVar107 = vrsqrtss_avx(auVar147,auVar147);
                fVar219 = auVar147._0_4_;
                fVar216 = auVar107._0_4_;
                fVar216 = fVar216 * 1.5 + fVar219 * -0.5 * fVar216 * fVar216 * fVar216;
                if (fVar219 < 0.0) {
                  local_8c0._0_16_ = auVar27;
                  local_9c0._0_4_ = fVar194;
                  local_9e0._0_16_ = auVar106;
                  local_9a0._0_16_ = ZEXT416((uint)fVar214);
                  local_8e0._0_4_ = fVar217;
                  local_820._0_4_ = fVar218;
                  local_780._0_4_ = fVar216;
                  fVar219 = sqrtf(fVar219);
                  auVar360 = ZEXT464((uint)local_a40._0_4_);
                  fVar216 = (float)local_780._0_4_;
                  fVar217 = (float)local_8e0._0_4_;
                  fVar218 = (float)local_820._0_4_;
                  auVar106 = local_9e0._0_16_;
                  fVar194 = (float)local_9c0._0_4_;
                  auVar27 = local_8c0._0_16_;
                  auVar107 = local_9a0._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar147,auVar147);
                  fVar219 = auVar107._0_4_;
                  auVar107 = ZEXT416((uint)fVar214);
                }
                auVar381 = ZEXT1664(auVar27);
                auVar367 = ZEXT464((uint)fVar194);
                auVar4 = vpermilps_avx(local_880._0_16_,0xff);
                auVar5 = vshufps_avx(auVar319,auVar319,0xff);
                fVar217 = fVar217 * fVar216 - auVar5._0_4_;
                auVar226._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar226._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar246._0_4_ = -fVar217;
                auVar246._4_4_ = 0x80000000;
                auVar246._8_4_ = 0x80000000;
                auVar246._12_4_ = 0x80000000;
                auVar256 = ZEXT1664(auVar246);
                fVar214 = auVar107._0_4_ * fVar218 * fVar216;
                auVar280 = ZEXT464((uint)fVar214);
                auVar147 = vinsertps_avx(auVar246,ZEXT416((uint)(fVar218 * fVar216)),0x1c);
                auVar106 = vmovsldup_avx(ZEXT416((uint)(fVar214 - auVar106._0_4_ * fVar217)));
                auVar147 = vdivps_avx(auVar147,auVar106);
                auVar107 = vinsertps_avx(auVar107,auVar226,0x10);
                auVar107 = vdivps_avx(auVar107,auVar106);
                auVar106 = vmovsldup_avx(auVar27);
                auVar109 = ZEXT416((uint)(fVar219 - auVar4._0_4_));
                auVar4 = vmovsldup_avx(auVar109);
                auVar176._0_4_ = auVar106._0_4_ * auVar147._0_4_ + auVar4._0_4_ * auVar107._0_4_;
                auVar176._4_4_ = auVar106._4_4_ * auVar147._4_4_ + auVar4._4_4_ * auVar107._4_4_;
                auVar176._8_4_ = auVar106._8_4_ * auVar147._8_4_ + auVar4._8_4_ * auVar107._8_4_;
                auVar176._12_4_ =
                     auVar106._12_4_ * auVar147._12_4_ + auVar4._12_4_ * auVar107._12_4_;
                auVar147 = vsubps_avx(auVar331,auVar176);
                auVar336 = ZEXT1664(auVar147);
                auVar177._8_4_ = 0x7fffffff;
                auVar177._0_8_ = 0x7fffffff7fffffff;
                auVar177._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar27,auVar177);
                if (auVar107._0_4_ < fVar194) {
                  auVar203._8_4_ = 0x7fffffff;
                  auVar203._0_8_ = 0x7fffffff7fffffff;
                  auVar203._12_4_ = 0x7fffffff;
                  auVar107 = vandps_avx(auVar109,auVar203);
                  if (auVar107._0_4_ <
                      (float)local_900._0_4_ * 1.9073486e-06 + auVar360._0_4_ + fVar194) {
                    fVar214 = auVar147._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar214) {
                      fVar216 = (ray->super_RayK<1>).tfar;
                      auVar280 = ZEXT464((uint)fVar216);
                      if (fVar214 <= fVar216) {
                        auVar107 = vmovshdup_avx(auVar147);
                        fVar217 = auVar107._0_4_;
                        if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                          auVar102 = vrsqrtss_avx(auVar102,auVar102);
                          fVar218 = auVar102._0_4_;
                          auVar256 = ZEXT464((uint)(fVar215 * -0.5));
                          pGVar10 = (context->scene->geometries).items[uVar91].ptr;
                          if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar102 = ZEXT416((uint)(fVar218 * 1.5 +
                                                     fVar215 * -0.5 * fVar218 * fVar218 * fVar218));
                            auVar102 = vshufps_avx(auVar102,auVar102,0);
                            auVar204._0_4_ = auVar102._0_4_ * (float)local_a60._0_4_;
                            auVar204._4_4_ = auVar102._4_4_ * (float)local_a60._4_4_;
                            auVar204._8_4_ = auVar102._8_4_ * fStack_a58;
                            auVar204._12_4_ = auVar102._12_4_ * fStack_a54;
                            auVar150._0_4_ = auVar319._0_4_ + auVar5._0_4_ * auVar204._0_4_;
                            auVar150._4_4_ = auVar319._4_4_ + auVar5._4_4_ * auVar204._4_4_;
                            auVar150._8_4_ = auVar319._8_4_ + auVar5._8_4_ * auVar204._8_4_;
                            auVar150._12_4_ = auVar319._12_4_ + auVar5._12_4_ * auVar204._12_4_;
                            auVar102 = vshufps_avx(auVar204,auVar204,0xc9);
                            auVar107 = vshufps_avx(auVar319,auVar319,0xc9);
                            auVar205._0_4_ = auVar107._0_4_ * auVar204._0_4_;
                            auVar205._4_4_ = auVar107._4_4_ * auVar204._4_4_;
                            auVar205._8_4_ = auVar107._8_4_ * auVar204._8_4_;
                            auVar205._12_4_ = auVar107._12_4_ * auVar204._12_4_;
                            auVar227._0_4_ = auVar319._0_4_ * auVar102._0_4_;
                            auVar227._4_4_ = auVar319._4_4_ * auVar102._4_4_;
                            auVar227._8_4_ = auVar319._8_4_ * auVar102._8_4_;
                            auVar227._12_4_ = auVar319._12_4_ * auVar102._12_4_;
                            auVar106 = vsubps_avx(auVar227,auVar205);
                            auVar102 = vshufps_avx(auVar106,auVar106,0xc9);
                            auVar107 = vshufps_avx(auVar150,auVar150,0xc9);
                            auVar256 = ZEXT1664(auVar107);
                            auVar228._0_4_ = auVar107._0_4_ * auVar102._0_4_;
                            auVar228._4_4_ = auVar107._4_4_ * auVar102._4_4_;
                            auVar228._8_4_ = auVar107._8_4_ * auVar102._8_4_;
                            auVar228._12_4_ = auVar107._12_4_ * auVar102._12_4_;
                            auVar102 = vshufps_avx(auVar106,auVar106,0xd2);
                            auVar151._0_4_ = auVar150._0_4_ * auVar102._0_4_;
                            auVar151._4_4_ = auVar150._4_4_ * auVar102._4_4_;
                            auVar151._8_4_ = auVar150._8_4_ * auVar102._8_4_;
                            auVar151._12_4_ = auVar150._12_4_ * auVar102._12_4_;
                            auVar102 = vsubps_avx(auVar228,auVar151);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar214;
                              auVar27 = vshufps_avx(auVar102,auVar102,0xe9);
                              uVar1 = vmovlps_avx(auVar27);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                              (ray->Ng).field_0.field_0.z = auVar102._0_4_;
                              ray->u = fVar217;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar91;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar106 = vshufps_avx(auVar102,auVar102,0xe9);
                              local_960 = vmovlps_avx(auVar106);
                              local_958 = auVar102._0_4_;
                              local_954 = fVar217;
                              local_950 = 0;
                              local_94c = local_920._0_4_;
                              local_948 = uVar91;
                              local_944 = context->user->instID[0];
                              local_940 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar214;
                              local_a64 = -1;
                              local_a98.valid = &local_a64;
                              local_a98.geometryUserPtr = pGVar10->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_960;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010122dd:
                                p_Var11 = context->args->filter;
                                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar256 = ZEXT1664(auVar256._0_16_);
                                  auVar280 = ZEXT1664(auVar280._0_16_);
                                  auVar336 = ZEXT1664(auVar336._0_16_);
                                  auVar360 = ZEXT1664(auVar360._0_16_);
                                  auVar367 = ZEXT1664(auVar367._0_16_);
                                  auVar381 = ZEXT1664(auVar381._0_16_);
                                  (*p_Var11)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_01012372;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar256 = ZEXT1664(auVar107);
                                auVar280 = ZEXT464((uint)fVar216);
                                auVar336 = ZEXT1664(auVar147);
                                auVar360 = ZEXT1664(auVar360._0_16_);
                                auVar367 = ZEXT464((uint)fVar194);
                                auVar381 = ZEXT1664(auVar27);
                                (*pGVar10->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_010122dd;
LAB_01012372:
                                (ray->super_RayK<1>).tfar = fVar216;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar96 = lVar96 + -1;
              } while (lVar96 != 0);
              auVar165 = local_740;
              fVar194 = (ray->super_RayK<1>).tfar;
              auVar119._4_4_ = fVar194;
              auVar119._0_4_ = fVar194;
              auVar119._8_4_ = fVar194;
              auVar119._12_4_ = fVar194;
              auVar119._16_4_ = fVar194;
              auVar119._20_4_ = fVar194;
              auVar119._24_4_ = fVar194;
              auVar119._28_4_ = fVar194;
              auVar111 = vcmpps_avx(_local_7a0,auVar119,2);
              local_740 = vandps_avx(auVar111,local_740);
              auVar165 = auVar165 & auVar111;
            } while ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar165 >> 0x7f,0) != '\0') ||
                       (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar165 >> 0xbf,0) != '\0') ||
                     (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar165[0x1f] < '\0');
            uVar95 = local_920._0_4_;
          }
          auVar111 = vandps_avx(local_600,local_5e0);
          auVar165 = vandps_avx(_local_7e0,local_7c0);
          auVar305 = ZEXT3264(_local_760);
          auVar230._0_4_ = local_760._0_4_ + local_4e0._0_4_;
          auVar230._4_4_ = local_760._4_4_ + local_4e0._4_4_;
          auVar230._8_4_ = local_760._8_4_ + local_4e0._8_4_;
          auVar230._12_4_ = local_760._12_4_ + local_4e0._12_4_;
          auVar230._16_4_ = local_760._16_4_ + local_4e0._16_4_;
          auVar230._20_4_ = local_760._20_4_ + local_4e0._20_4_;
          auVar230._24_4_ = local_760._24_4_ + local_4e0._24_4_;
          auVar230._28_4_ = local_760._28_4_ + local_4e0._28_4_;
          auVar15 = vcmpps_avx(auVar230,auVar119,2);
          auVar111 = vandps_avx(auVar15,auVar111);
          auVar231._0_4_ = local_520._0_4_ + local_760._0_4_;
          auVar231._4_4_ = local_520._4_4_ + local_760._4_4_;
          auVar231._8_4_ = local_520._8_4_ + local_760._8_4_;
          auVar231._12_4_ = local_520._12_4_ + local_760._12_4_;
          auVar231._16_4_ = local_520._16_4_ + local_760._16_4_;
          auVar231._20_4_ = local_520._20_4_ + local_760._20_4_;
          auVar231._24_4_ = local_520._24_4_ + local_760._24_4_;
          auVar231._28_4_ = local_520._28_4_ + local_760._28_4_;
          auVar15 = vcmpps_avx(auVar231,auVar119,2);
          auVar165 = vandps_avx(auVar15,auVar165);
          auVar165 = vorps_avx(auVar111,auVar165);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar165;
            auVar111 = vblendvps_avx(_local_520,local_4e0,auVar111);
            *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar111;
            uVar1 = vmovlps_avx(local_530);
            (&uStack_140)[uVar94 * 0xc] = uVar1;
            aiStack_138[uVar94 * 0x18] = local_b0c + 1;
            iVar98 = iVar98 + 1;
          }
        }
      }
    }
    fVar194 = (ray->super_RayK<1>).tfar;
    auVar122._4_4_ = fVar194;
    auVar122._0_4_ = fVar194;
    auVar122._8_4_ = fVar194;
    auVar122._12_4_ = fVar194;
    auVar122._16_4_ = fVar194;
    auVar122._20_4_ = fVar194;
    auVar122._24_4_ = fVar194;
    auVar122._28_4_ = fVar194;
    if (iVar98 == 0) break;
    uVar92 = -iVar98;
    pauVar90 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar98 - 1) * 0x60);
    while( true ) {
      auVar111 = pauVar90[1];
      auVar164._0_4_ = auVar111._0_4_ + (float)local_760._0_4_;
      auVar164._4_4_ = auVar111._4_4_ + (float)local_760._4_4_;
      auVar164._8_4_ = auVar111._8_4_ + fStack_758;
      auVar164._12_4_ = auVar111._12_4_ + fStack_754;
      auVar164._16_4_ = auVar111._16_4_ + fStack_750;
      auVar164._20_4_ = auVar111._20_4_ + fStack_74c;
      auVar164._24_4_ = auVar111._24_4_ + fStack_748;
      auVar164._28_4_ = auVar111._28_4_ + fStack_744;
      auVar15 = vcmpps_avx(auVar164,auVar122,2);
      auVar165 = vandps_avx(auVar15,*pauVar90);
      local_4e0 = auVar165;
      auVar15 = *pauVar90 & auVar15;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') break;
      pauVar90 = pauVar90 + -3;
      uVar92 = uVar92 + 1;
      if (uVar92 == 0) goto LAB_01012645;
    }
    auVar123._8_4_ = 0x7f800000;
    auVar123._0_8_ = 0x7f8000007f800000;
    auVar123._12_4_ = 0x7f800000;
    auVar123._16_4_ = 0x7f800000;
    auVar123._20_4_ = 0x7f800000;
    auVar123._24_4_ = 0x7f800000;
    auVar123._28_4_ = 0x7f800000;
    auVar111 = vblendvps_avx(auVar123,auVar111,auVar165);
    auVar15 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar15 = vminps_avx(auVar111,auVar15);
    auVar16 = vshufpd_avx(auVar15,auVar15,5);
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar16 = vperm2f128_avx(auVar15,auVar15,1);
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar111 = vcmpps_avx(auVar111,auVar15,0);
    auVar15 = auVar165 & auVar111;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar165 = vandps_avx(auVar111,auVar165);
    }
    auVar110._8_8_ = 0;
    auVar110._0_8_ = *(ulong *)pauVar90[2];
    local_b0c = *(uint *)(pauVar90[2] + 8);
    uVar93 = vmovmskps_avx(auVar165);
    uVar88 = 0;
    if (uVar93 != 0) {
      for (; (uVar93 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
      }
    }
    *(undefined4 *)(local_4e0 + (ulong)uVar88 * 4) = 0;
    *pauVar90 = local_4e0;
    uVar93 = ~uVar92;
    if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4e0 >> 0x7f,0) != '\0') ||
          (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4e0 >> 0xbf,0) != '\0') ||
        (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4e0[0x1f] < '\0') {
      uVar93 = -uVar92;
    }
    uVar94 = (ulong)uVar93;
    auVar102 = vshufps_avx(auVar110,auVar110,0);
    auVar27 = vshufps_avx(auVar110,auVar110,0x55);
    auVar27 = vsubps_avx(auVar27,auVar102);
    local_520._4_4_ = auVar102._4_4_ + auVar27._4_4_ * 0.14285715;
    local_520._0_4_ = auVar102._0_4_ + auVar27._0_4_ * 0.0;
    fStack_518 = auVar102._8_4_ + auVar27._8_4_ * 0.2857143;
    fStack_514 = auVar102._12_4_ + auVar27._12_4_ * 0.42857146;
    fStack_510 = auVar102._0_4_ + auVar27._0_4_ * 0.5714286;
    fStack_50c = auVar102._4_4_ + auVar27._4_4_ * 0.71428573;
    fStack_508 = auVar102._8_4_ + auVar27._8_4_ * 0.8571429;
    fStack_504 = auVar102._12_4_ + auVar27._12_4_;
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_520 + (ulong)uVar88 * 4);
  } while( true );
LAB_01012645:
  auVar111 = vcmpps_avx(local_2c0,auVar122,2);
  uVar91 = vmovmskps_avx(auVar111);
  uVar91 = (uint)uVar97 & uVar91;
  if (uVar91 == 0) {
    return;
  }
  goto LAB_0100fcd2;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }